

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void idct64x64_low16_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  int *piVar1;
  uint *puVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [12];
  longlong lVar100;
  longlong lVar101;
  longlong lVar102;
  longlong lVar103;
  longlong lVar104;
  longlong lVar105;
  longlong lVar106;
  undefined8 uVar107;
  uint *puVar108;
  long lVar109;
  ulong uVar110;
  long lVar111;
  int iVar112;
  int iVar113;
  ulong uVar114;
  int iVar115;
  int iVar116;
  int iVar117;
  int iVar118;
  ulong uVar119;
  int iVar120;
  int iVar121;
  ulong uVar122;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  int iVar131;
  uint uVar132;
  int iVar143;
  int iVar146;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  uint uVar144;
  int iVar145;
  uint uVar147;
  int iVar148;
  uint uVar149;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  int iVar196;
  uint uVar197;
  int iVar202;
  int iVar204;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  uint uVar203;
  uint uVar205;
  int iVar206;
  uint uVar207;
  undefined1 auVar201 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  __m128i rnding;
  __m128i u [64];
  __m128i clamp_lo_out;
  undefined8 local_588;
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  undefined8 local_558;
  undefined1 local_548 [16];
  undefined8 local_528;
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined8 local_4f8;
  undefined8 local_4e8;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4a8;
  uint local_458 [8];
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  int local_418;
  int iStack_414;
  int iStack_410;
  int iStack_40c;
  int local_408;
  int iStack_404;
  int iStack_400;
  int iStack_3fc;
  uint local_3f8;
  int iStack_3f4;
  int iStack_3f0;
  int iStack_3ec;
  uint local_3e8 [7];
  uint uStack_3cc;
  uint local_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  uint local_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint local_3a8;
  uint uStack_3a4;
  uint uStack_3a0;
  uint uStack_39c;
  uint local_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint local_388;
  uint uStack_384;
  uint uStack_380;
  uint uStack_37c;
  uint local_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint local_368 [11];
  int iStack_33c;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  int local_328;
  int iStack_324;
  int iStack_320;
  int iStack_31c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  uint local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  int iStack_2bc;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_2a8;
  int iStack_2a4;
  int iStack_2a0;
  int iStack_29c;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  uint local_268 [11];
  int iStack_23c;
  int local_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  int local_228;
  int iStack_224;
  int iStack_220;
  int iStack_21c;
  int local_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  uint local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  uint local_158 [7];
  int iStack_13c;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  auVar217 = ZEXT416((uint)bit);
  lVar109 = (long)bit * 0x100;
  iVar115 = 1 << ((char)bit - 1U & 0x1f);
  iVar116 = bd + (uint)(do_cols == 0) * 2;
  iVar117 = 0x8000;
  if (0xf < iVar116 + 6) {
    iVar117 = 1 << ((char)iVar116 + 5U & 0x1f);
  }
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 0x164);
  auVar133._4_4_ = uVar3;
  auVar133._0_4_ = uVar3;
  auVar133._8_4_ = uVar3;
  auVar133._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 0x16c);
  auVar176._4_4_ = uVar3;
  auVar176._0_4_ = uVar3;
  auVar176._8_4_ = uVar3;
  auVar176._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 0x174);
  auVar168._4_4_ = uVar3;
  auVar168._0_4_ = uVar3;
  auVar168._8_4_ = uVar3;
  auVar168._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 0x17c);
  auVar164._4_4_ = uVar3;
  auVar164._0_4_ = uVar3;
  auVar164._8_4_ = uVar3;
  auVar164._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 0x184);
  auVar158._4_4_ = uVar3;
  auVar158._0_4_ = uVar3;
  auVar158._8_4_ = uVar3;
  auVar158._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 0x18c);
  auVar184._4_4_ = uVar3;
  auVar184._0_4_ = uVar3;
  auVar184._8_4_ = uVar3;
  auVar184._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 0x19c);
  auVar152._4_4_ = uVar3;
  auVar152._0_4_ = uVar3;
  auVar152._8_4_ = uVar3;
  auVar152._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 0x23c);
  auVar189._4_4_ = uVar3;
  auVar189._0_4_ = uVar3;
  auVar189._8_4_ = uVar3;
  auVar189._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 0x24c);
  auVar198._4_4_ = uVar3;
  auVar198._0_4_ = uVar3;
  auVar198._8_4_ = uVar3;
  auVar198._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 0x25c);
  auVar208._4_4_ = uVar3;
  auVar208._0_4_ = uVar3;
  auVar208._8_4_ = uVar3;
  auVar208._12_4_ = uVar3;
  iVar116 = -*(int *)((long)vert_filter_length_chroma + lVar109 + 0x224);
  iVar145 = -*(int *)((long)vert_filter_length_chroma + lVar109 + 0x234);
  iVar120 = -*(int *)((long)vert_filter_length_chroma + lVar109 + 0x244);
  iVar112 = -*(int *)((long)vert_filter_length_chroma + lVar109 + 0x254);
  auVar99 = *(undefined1 (*) [12])*in;
  puVar108 = &local_1e8;
  local_458[0] = (uint)(*in)[0];
  local_458[1] = (uint)((ulong)(*in)[0] >> 0x20);
  local_458[2] = (uint)(*in)[1];
  local_458[3] = (uint)((ulong)(*in)[1] >> 0x20);
  local_268[7] = (uint)((ulong)in[1][1] >> 0x20);
  iStack_20c = (int)((ulong)in[9][1] >> 0x20);
  iStack_1cc = (int)((ulong)in[5][1] >> 0x20);
  iStack_18c = (int)((ulong)in[0xd][1] >> 0x20);
  local_158[3] = (uint)((ulong)in[3][1] >> 0x20);
  iStack_10c = (int)((ulong)in[0xb][1] >> 0x20);
  iStack_cc = (int)((ulong)in[7][1] >> 0x20);
  iStack_8c = (int)((ulong)in[0xf][1] >> 0x20);
  local_368[7] = (uint)((ulong)in[2][1] >> 0x20);
  iStack_30c = (int)((ulong)in[10][1] >> 0x20);
  iStack_2cc = (int)((ulong)in[6][1] >> 0x20);
  iStack_28c = (int)((ulong)in[0xe][1] >> 0x20);
  iStack_40c = (int)((ulong)in[8][1] >> 0x20);
  uStack_3cc = (uint)((ulong)in[4][1] >> 0x20);
  uStack_38c = (uint)((ulong)in[0xc][1] >> 0x20);
  auVar216._12_4_ = local_268[7];
  auVar216._0_12_ = *(undefined1 (*) [12])in[1];
  auVar134 = pmulld(auVar133,auVar216);
  local_518._0_4_ = auVar134._0_4_ + iVar115 >> auVar217;
  local_518._4_4_ = auVar134._4_4_ + iVar115 >> auVar217;
  local_518._8_4_ = auVar134._8_4_ + iVar115 >> auVar217;
  local_518._12_4_ = auVar134._12_4_ + iVar115 >> auVar217;
  auVar212._4_4_ = iVar116;
  auVar212._0_4_ = iVar116;
  auVar212._8_4_ = iVar116;
  auVar212._12_4_ = iVar116;
  local_68 = local_518._0_4_;
  iStack_64 = local_518._4_4_;
  iStack_60 = local_518._8_4_;
  iStack_5c = local_518._12_4_;
  auVar134 = pmulld(auVar208,auVar216);
  local_508._0_4_ = auVar134._0_4_ + iVar115 >> auVar217;
  local_508._4_4_ = auVar134._4_4_ + iVar115 >> auVar217;
  local_268[6] = auVar134._8_4_ + iVar115 >> auVar217;
  local_268[7] = auVar134._12_4_ + iVar115 >> auVar217;
  uVar107 = local_508._0_8_;
  local_268[4] = local_508._0_4_;
  local_268[5] = local_508._4_4_;
  auVar96._12_4_ = iStack_8c;
  auVar96._0_12_ = *(undefined1 (*) [12])in[0xf];
  auVar134 = pmulld(auVar212,auVar96);
  local_228 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_224 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_220 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_21c = auVar134._12_4_ + iVar115 >> auVar217;
  local_4e8 = CONCAT44(iStack_224,local_228);
  auVar134 = pmulld(auVar152,auVar96);
  local_578._0_4_ = auVar134._0_4_ + iVar115 >> auVar217;
  local_578._4_4_ = auVar134._4_4_ + iVar115 >> auVar217;
  local_578._8_4_ = auVar134._8_4_ + iVar115 >> auVar217;
  local_578._12_4_ = auVar134._12_4_ + iVar115 >> auVar217;
  local_98 = local_578._0_4_;
  iStack_94 = local_578._4_4_;
  iStack_90 = local_578._8_4_;
  iStack_8c = local_578._12_4_;
  auVar36._12_4_ = iStack_20c;
  auVar36._0_12_ = *(undefined1 (*) [12])in[9];
  auVar134 = pmulld(auVar158,auVar36);
  local_548._0_4_ = auVar134._0_4_ + iVar115 >> auVar217;
  local_548._4_4_ = auVar134._4_4_ + iVar115 >> auVar217;
  local_548._8_4_ = auVar134._8_4_ + iVar115 >> auVar217;
  local_548._12_4_ = auVar134._12_4_ + iVar115 >> auVar217;
  auVar213._4_4_ = iVar120;
  auVar213._0_4_ = iVar120;
  auVar213._8_4_ = iVar120;
  auVar213._12_4_ = iVar120;
  local_a8 = local_548._0_4_;
  iStack_a4 = local_548._4_4_;
  iStack_a0 = local_548._8_4_;
  iStack_9c = local_548._12_4_;
  auVar134 = pmulld(auVar189,auVar36);
  local_218 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_214 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_210 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_20c = auVar134._12_4_ + iVar115 >> auVar217;
  local_528 = CONCAT44(iStack_214,local_218);
  auVar89._12_4_ = iStack_cc;
  auVar89._0_12_ = *(undefined1 (*) [12])in[7];
  auVar134 = pmulld(auVar213,auVar89);
  local_1e8 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_1e4 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_1e0 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_1dc = auVar134._12_4_ + iVar115 >> auVar217;
  auVar134 = pmulld(auVar164,auVar89);
  local_568._0_4_ = auVar134._0_4_ + iVar115 >> auVar217;
  local_568._4_4_ = auVar134._4_4_ + iVar115 >> auVar217;
  local_568._8_4_ = auVar134._8_4_ + iVar115 >> auVar217;
  local_568._12_4_ = auVar134._12_4_ + iVar115 >> auVar217;
  local_d8 = local_568._0_4_;
  iStack_d4 = local_568._4_4_;
  iStack_d0 = local_568._8_4_;
  iStack_cc = local_568._12_4_;
  auVar45._12_4_ = iStack_1cc;
  auVar45._0_12_ = *(undefined1 (*) [12])in[5];
  auVar134 = pmulld(auVar168,auVar45);
  local_e8 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_e4 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_e0 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_dc = auVar134._12_4_ + iVar115 >> auVar217;
  local_588 = CONCAT44(iStack_e4,local_e8);
  auVar169._4_4_ = iVar145;
  auVar169._0_4_ = iVar145;
  auVar169._8_4_ = iVar145;
  auVar169._12_4_ = iVar145;
  auVar134 = pmulld(auVar198,auVar45);
  local_1d8 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_1d4 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_1d0 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_1cc = auVar134._12_4_ + iVar115 >> auVar217;
  local_558 = CONCAT44(iStack_1d4,local_1d8);
  auVar76._12_4_ = iStack_10c;
  auVar76._0_12_ = *(undefined1 (*) [12])in[0xb];
  auVar134 = pmulld(auVar169,auVar76);
  auVar185 = pmulld(auVar184,auVar76);
  auVar150._4_4_ = iVar112;
  auVar150._0_4_ = iVar112;
  auVar150._8_4_ = iVar112;
  auVar150._12_4_ = iVar112;
  local_1a8 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_1a4 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_1a0 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_19c = auVar134._12_4_ + iVar115 >> auVar217;
  local_118 = auVar185._0_4_ + iVar115 >> auVar217;
  iStack_114 = auVar185._4_4_ + iVar115 >> auVar217;
  iStack_110 = auVar185._8_4_ + iVar115 >> auVar217;
  iStack_10c = auVar185._12_4_ + iVar115 >> auVar217;
  local_4f8 = CONCAT44(iStack_114,local_118);
  auVar67._12_4_ = local_158[3];
  auVar67._0_12_ = *(undefined1 (*) [12])in[3];
  auVar134 = pmulld(auVar150,auVar67);
  auVar185 = pmulld(auVar176,auVar67);
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 0x194);
  auVar123._4_4_ = uVar3;
  auVar123._0_4_ = uVar3;
  auVar123._8_4_ = uVar3;
  auVar123._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 0x22c);
  auVar186._4_4_ = uVar3;
  auVar186._0_4_ = uVar3;
  auVar186._8_4_ = uVar3;
  auVar186._12_4_ = uVar3;
  local_168 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_164 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_160 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_15c = auVar134._12_4_ + iVar115 >> auVar217;
  local_158[0] = auVar185._0_4_ + iVar115 >> auVar217;
  local_158[1] = auVar185._4_4_ + iVar115 >> auVar217;
  local_158[2] = auVar185._8_4_ + iVar115 >> auVar217;
  local_158[3] = auVar185._12_4_ + iVar115 >> auVar217;
  local_4c8 = CONCAT44(local_158[1],local_158[0]);
  auVar58._12_4_ = iStack_18c;
  auVar58._0_12_ = *(undefined1 (*) [12])in[0xd];
  auVar134 = pmulld(auVar123,auVar58);
  auVar185 = pmulld(auVar186,auVar58);
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 0x168);
  auVar135._4_4_ = uVar3;
  auVar135._0_4_ = uVar3;
  auVar135._8_4_ = uVar3;
  auVar135._12_4_ = uVar3;
  local_128 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_124 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_120 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_11c = auVar134._12_4_ + iVar115 >> auVar217;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 600);
  auVar159._4_4_ = uVar3;
  auVar159._0_4_ = uVar3;
  auVar159._8_4_ = uVar3;
  auVar159._12_4_ = uVar3;
  local_198 = auVar185._0_4_ + iVar115 >> auVar217;
  iStack_194 = auVar185._4_4_ + iVar115 >> auVar217;
  iStack_190 = auVar185._8_4_ + iVar115 >> auVar217;
  iStack_18c = auVar185._12_4_ + iVar115 >> auVar217;
  auVar154._12_4_ = local_368[7];
  auVar154._0_12_ = *(undefined1 (*) [12])in[2];
  auVar134 = pmulld(auVar135,auVar154);
  auVar185 = pmulld(auVar159,auVar154);
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 0x198);
  auVar220._4_4_ = uVar3;
  auVar220._0_4_ = uVar3;
  auVar220._8_4_ = uVar3;
  auVar220._12_4_ = uVar3;
  iVar116 = -*(int *)((long)vert_filter_length_chroma + lVar109 + 0x228);
  auVar177._4_4_ = iVar116;
  auVar177._0_4_ = iVar116;
  auVar177._8_4_ = iVar116;
  auVar177._12_4_ = iVar116;
  local_268[0] = auVar134._0_4_ + iVar115 >> auVar217;
  local_268[1] = auVar134._4_4_ + iVar115 >> auVar217;
  local_268[2] = auVar134._8_4_ + iVar115 >> auVar217;
  local_268[3] = auVar134._12_4_ + iVar115 >> auVar217;
  local_4d8 = CONCAT44(local_268[1],local_268[0]);
  local_368[4] = auVar185._0_4_ + iVar115 >> auVar217;
  local_368[5] = auVar185._4_4_ + iVar115 >> auVar217;
  local_368[6] = auVar185._8_4_ + iVar115 >> auVar217;
  local_368[7] = auVar185._12_4_ + iVar115 >> auVar217;
  local_4a8 = CONCAT44(local_368[5],local_368[4]);
  auVar182._12_4_ = iStack_28c;
  auVar182._0_12_ = *(undefined1 (*) [12])in[0xe];
  auVar134 = pmulld(auVar177,auVar182);
  auVar185 = pmulld(auVar220,auVar182);
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 0x188);
  auVar160._4_4_ = uVar3;
  auVar160._0_4_ = uVar3;
  auVar160._8_4_ = uVar3;
  auVar160._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 0x238);
  auVar165._4_4_ = uVar3;
  auVar165._0_4_ = uVar3;
  auVar165._8_4_ = uVar3;
  auVar165._12_4_ = uVar3;
  local_328 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_324 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_320 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_31c = auVar134._12_4_ + iVar115 >> auVar217;
  local_298 = auVar185._0_4_ + iVar115 >> auVar217;
  iStack_294 = auVar185._4_4_ + iVar115 >> auVar217;
  iStack_290 = auVar185._8_4_ + iVar115 >> auVar217;
  iStack_28c = auVar185._12_4_ + iVar115 >> auVar217;
  auVar167._12_4_ = iStack_30c;
  auVar167._0_12_ = *(undefined1 (*) [12])in[10];
  auVar134 = pmulld(auVar160,auVar167);
  auVar185 = pmulld(auVar165,auVar167);
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar109 + 0x178);
  auVar190._4_4_ = uVar3;
  auVar190._0_4_ = uVar3;
  auVar190._8_4_ = uVar3;
  auVar190._12_4_ = uVar3;
  iVar116 = -*(int *)((long)vert_filter_length_chroma + lVar109 + 0x248);
  auVar199._4_4_ = iVar116;
  auVar199._0_4_ = iVar116;
  auVar199._8_4_ = iVar116;
  auVar199._12_4_ = iVar116;
  local_2a8 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_2a4 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_2a0 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_29c = auVar134._12_4_ + iVar115 >> auVar217;
  local_318 = auVar185._0_4_ + iVar115 >> auVar217;
  iStack_314 = auVar185._4_4_ + iVar115 >> auVar217;
  iStack_310 = auVar185._8_4_ + iVar115 >> auVar217;
  iStack_30c = auVar185._12_4_ + iVar115 >> auVar217;
  auVar214._12_4_ = iStack_2cc;
  auVar214._0_12_ = *(undefined1 (*) [12])in[6];
  auVar185 = pmulld(auVar199,auVar214);
  auVar134 = pmulld(auVar190,auVar214);
  local_2e8 = auVar185._0_4_ + iVar115 >> auVar217;
  iStack_2e4 = auVar185._4_4_ + iVar115 >> auVar217;
  iStack_2e0 = auVar185._8_4_ + iVar115 >> auVar217;
  iStack_2dc = auVar185._12_4_ + iVar115 >> auVar217;
  local_2d8 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_2d4 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_2d0 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_2cc = auVar134._12_4_ + iVar115 >> auVar217;
  iVar116 = *(int *)((long)vert_filter_length_chroma + lVar109 + 0x170);
  auVar170._4_4_ = iVar116;
  auVar170._0_4_ = iVar116;
  auVar170._8_4_ = iVar116;
  auVar170._12_4_ = iVar116;
  local_508._4_4_ = *(int *)((long)vert_filter_length_chroma + lVar109 + 400);
  local_508._0_4_ = local_508._4_4_;
  local_508._8_4_ = local_508._4_4_;
  local_508._12_4_ = local_508._4_4_;
  iVar145 = *(int *)((long)vert_filter_length_chroma + lVar109 + 0x230);
  iVar120 = *(int *)((long)vert_filter_length_chroma + lVar109 + 0x250);
  auVar136._4_4_ = iVar120;
  auVar136._0_4_ = iVar120;
  auVar136._8_4_ = iVar120;
  auVar136._12_4_ = iVar120;
  iVar112 = -iVar145;
  auVar153._4_4_ = iVar112;
  auVar153._0_4_ = iVar112;
  auVar153._8_4_ = iVar112;
  auVar153._12_4_ = iVar112;
  auVar185._12_4_ = uStack_3cc;
  auVar185._0_12_ = *(undefined1 (*) [12])in[4];
  auVar134 = pmulld(auVar185,auVar170);
  local_368[0] = auVar134._0_4_ + iVar115 >> auVar217;
  local_368[1] = auVar134._4_4_ + iVar115 >> auVar217;
  local_368[2] = auVar134._8_4_ + iVar115 >> auVar217;
  local_368[3] = auVar134._12_4_ + iVar115 >> auVar217;
  auVar151._12_4_ = uStack_38c;
  auVar151._0_12_ = *(undefined1 (*) [12])in[0xc];
  auVar218._8_4_ = local_268[6];
  auVar218._0_8_ = uVar107;
  auVar218._12_4_ = local_268[7];
  auVar33._8_4_ = iStack_220;
  auVar33._0_8_ = local_4e8;
  auVar33._12_4_ = iStack_21c;
  auVar134 = pmulld(auVar185,auVar136);
  local_3e8[4] = auVar134._0_4_ + iVar115 >> auVar217;
  local_3e8[5] = auVar134._4_4_ + iVar115 >> auVar217;
  local_3e8[6] = auVar134._8_4_ + iVar115 >> auVar217;
  uStack_3cc = auVar134._12_4_ + iVar115 >> auVar217;
  auVar134 = pmulld(auVar151,auVar153);
  local_3a8 = auVar134._0_4_ + iVar115 >> auVar217;
  uStack_3a4 = auVar134._4_4_ + iVar115 >> auVar217;
  uStack_3a0 = auVar134._8_4_ + iVar115 >> auVar217;
  uStack_39c = auVar134._12_4_ + iVar115 >> auVar217;
  auVar134 = pmulld(auVar151,local_508);
  local_398 = auVar134._0_4_ + iVar115 >> auVar217;
  uStack_394 = auVar134._4_4_ + iVar115 >> auVar217;
  uStack_390 = auVar134._8_4_ + iVar115 >> auVar217;
  uStack_38c = auVar134._12_4_ + iVar115 >> auVar217;
  iVar116 = -iVar116;
  auVar221._4_4_ = iVar116;
  auVar221._0_4_ = iVar116;
  auVar221._8_4_ = iVar116;
  auVar221._12_4_ = iVar116;
  auVar154 = pmulld(auVar218,auVar221);
  auVar214 = pmulld(local_518,auVar136);
  iVar120 = -iVar120;
  auVar161._4_4_ = iVar120;
  auVar161._0_4_ = iVar120;
  auVar161._8_4_ = iVar120;
  auVar161._12_4_ = iVar120;
  auVar162 = pmulld(auVar161,auVar33);
  auVar166 = pmulld(local_578,auVar221);
  iVar116 = *(int *)((long)vert_filter_length_chroma + lVar109 + 0x1d0);
  auVar200._4_4_ = iVar116;
  auVar200._0_4_ = iVar116;
  auVar200._8_4_ = iVar116;
  auVar200._12_4_ = iVar116;
  iVar120 = *(int *)((long)vert_filter_length_chroma + lVar109 + 0x1f0);
  iVar112 = -iVar120;
  auVar209._4_4_ = iVar112;
  auVar209._0_4_ = iVar112;
  auVar209._8_4_ = iVar112;
  auVar209._12_4_ = iVar112;
  auVar39._8_4_ = iStack_210;
  auVar39._0_8_ = local_528;
  auVar39._12_4_ = iStack_20c;
  auVar167 = pmulld(auVar39,auVar209);
  auVar178 = pmulld(local_548,auVar200);
  iVar116 = -iVar116;
  auVar179._4_4_ = iVar116;
  auVar179._0_4_ = iVar116;
  auVar179._8_4_ = iVar116;
  auVar179._12_4_ = iVar116;
  auVar42._4_4_ = iStack_1e4;
  auVar42._0_4_ = local_1e8;
  auVar42._8_4_ = iStack_1e0;
  auVar42._12_4_ = iStack_1dc;
  auVar180 = pmulld(auVar179,auVar42);
  auVar134 = pmulld(local_568,auVar209);
  auVar185 = pmulld(auVar42,auVar209);
  auVar151 = pmulld(local_568,auVar200);
  local_c8 = auVar185._0_4_ + iVar115 + auVar151._0_4_ >> auVar217;
  iStack_c4 = auVar185._4_4_ + iVar115 + auVar151._4_4_ >> auVar217;
  iStack_c0 = auVar185._8_4_ + iVar115 + auVar151._8_4_ >> auVar217;
  iStack_bc = auVar185._12_4_ + iVar115 + auVar151._12_4_ >> auVar217;
  auVar151 = pmulld(auVar39,auVar200);
  auVar124._4_4_ = iVar120;
  auVar124._0_4_ = iVar120;
  auVar124._8_4_ = iVar120;
  auVar124._12_4_ = iVar120;
  auVar185 = pmulld(local_548,auVar124);
  local_b8 = auVar151._0_4_ + iVar115 + auVar185._0_4_ >> auVar217;
  iStack_b4 = auVar151._4_4_ + iVar115 + auVar185._4_4_ >> auVar217;
  iStack_b0 = auVar151._8_4_ + iVar115 + auVar185._8_4_ >> auVar217;
  iStack_ac = auVar151._12_4_ + iVar115 + auVar185._12_4_ >> auVar217;
  auVar151 = pmulld(auVar33,auVar221);
  auVar185 = pmulld(local_578,auVar136);
  local_88 = auVar151._0_4_ + iVar115 + auVar185._0_4_ >> auVar217;
  iStack_84 = auVar151._4_4_ + iVar115 + auVar185._4_4_ >> auVar217;
  iStack_80 = auVar151._8_4_ + iVar115 + auVar185._8_4_ >> auVar217;
  iStack_7c = auVar151._12_4_ + iVar115 + auVar185._12_4_ >> auVar217;
  auVar151 = pmulld(auVar218,auVar136);
  iVar116 = *(int *)((long)vert_filter_length_chroma + lVar109 + 0x1b0);
  auVar185 = pmulld(local_518,auVar170);
  iVar112 = -iVar116;
  iVar120 = *(int *)((long)vert_filter_length_chroma + lVar109 + 0x210);
  iStack_74 = auVar151._4_4_ + iVar115 + auVar185._4_4_ >> auVar217;
  local_78 = auVar151._0_4_ + iVar115 + auVar185._0_4_ >> auVar217;
  iStack_70 = auVar151._8_4_ + iVar115 + auVar185._8_4_ >> auVar217;
  iStack_6c = auVar151._12_4_ + iVar115 + auVar185._12_4_ >> auVar217;
  iVar121 = -iVar120;
  local_268[8] = auVar154._0_4_ + iVar115 + auVar214._0_4_ >> auVar217;
  local_268[9] = auVar154._4_4_ + iVar115 + auVar214._4_4_ >> auVar217;
  local_268[10] = auVar154._8_4_ + iVar115 + auVar214._8_4_ >> auVar217;
  iStack_23c = auVar154._12_4_ + iVar115 + auVar214._12_4_ >> auVar217;
  auVar155._4_4_ = iVar116;
  auVar155._0_4_ = iVar116;
  auVar155._8_4_ = iVar116;
  auVar155._12_4_ = iVar116;
  auVar171._4_4_ = iVar120;
  auVar171._0_4_ = iVar120;
  auVar171._8_4_ = iVar120;
  auVar171._12_4_ = iVar120;
  auVar137._4_4_ = iVar112;
  auVar137._0_4_ = iVar112;
  auVar137._8_4_ = iVar112;
  auVar137._12_4_ = iVar112;
  auVar125._4_4_ = iVar121;
  auVar125._0_4_ = iVar121;
  auVar125._8_4_ = iVar121;
  auVar125._12_4_ = iVar121;
  local_238 = auVar162._0_4_ + iVar115 + auVar166._0_4_ >> auVar217;
  iStack_234 = auVar162._4_4_ + iVar115 + auVar166._4_4_ >> auVar217;
  iStack_230 = auVar162._8_4_ + iVar115 + auVar166._8_4_ >> auVar217;
  iStack_22c = auVar162._12_4_ + iVar115 + auVar166._12_4_ >> auVar217;
  local_208 = auVar167._0_4_ + iVar115 + auVar178._0_4_ >> auVar217;
  iStack_204 = auVar167._4_4_ + iVar115 + auVar178._4_4_ >> auVar217;
  iStack_200 = auVar167._8_4_ + iVar115 + auVar178._8_4_ >> auVar217;
  iStack_1fc = auVar167._12_4_ + iVar115 + auVar178._12_4_ >> auVar217;
  local_1f8 = auVar180._0_4_ + iVar115 + auVar134._0_4_ >> auVar217;
  iStack_1f4 = auVar180._4_4_ + iVar115 + auVar134._4_4_ >> auVar217;
  iStack_1f0 = auVar180._8_4_ + iVar115 + auVar134._8_4_ >> auVar217;
  iStack_1ec = auVar180._12_4_ + iVar115 + auVar134._12_4_ >> auVar217;
  auVar48._8_4_ = iStack_1d0;
  auVar48._0_8_ = local_558;
  auVar48._12_4_ = iStack_1cc;
  auVar166 = pmulld(auVar48,auVar137);
  auVar84._8_4_ = iStack_e0;
  auVar84._0_8_ = local_588;
  auVar84._12_4_ = iStack_dc;
  auVar154 = pmulld(auVar155,auVar84);
  auVar178 = pmulld(auVar84,auVar171);
  auVar51._4_4_ = iStack_1a4;
  auVar51._0_4_ = local_1a8;
  auVar51._8_4_ = iStack_1a0;
  auVar51._12_4_ = iStack_19c;
  auVar134 = pmulld(auVar125,auVar51);
  auVar80._8_4_ = iStack_110;
  auVar80._0_8_ = local_4f8;
  auVar80._12_4_ = iStack_10c;
  auVar151 = pmulld(auVar80,auVar137);
  auVar156._4_4_ = iVar145;
  auVar156._0_4_ = iVar145;
  auVar156._8_4_ = iVar145;
  auVar156._12_4_ = iVar145;
  auVar61._4_4_ = iStack_194;
  auVar61._0_4_ = local_198;
  auVar61._8_4_ = iStack_190;
  auVar61._12_4_ = iStack_18c;
  auVar180 = pmulld(auVar61,auVar153);
  auVar71._4_4_ = iStack_124;
  auVar71._0_4_ = local_128;
  auVar71._8_4_ = iStack_120;
  auVar71._12_4_ = iStack_11c;
  auVar162 = pmulld(auVar156,auVar71);
  auVar167 = pmulld(auVar71,local_508);
  iVar116 = -local_508._4_4_;
  auVar187._4_4_ = iVar116;
  auVar187._0_4_ = iVar116;
  auVar187._8_4_ = iVar116;
  auVar187._12_4_ = iVar116;
  auVar64._4_4_ = iStack_164;
  auVar64._0_4_ = local_168;
  auVar64._8_4_ = iStack_160;
  auVar64._12_4_ = iStack_15c;
  auVar214 = pmulld(auVar187,auVar64);
  auVar69._8_4_ = local_158[2];
  auVar69._0_8_ = local_4c8;
  auVar69._12_4_ = local_158[3];
  auVar185 = pmulld(auVar69,auVar153);
  auVar215 = pmulld(auVar64,auVar153);
  auVar222 = pmulld(auVar69,local_508);
  local_158[4] = auVar222._0_4_ + iVar115 + auVar215._0_4_ >> auVar217;
  local_158[5] = auVar222._4_4_ + iVar115 + auVar215._4_4_ >> auVar217;
  local_158[6] = auVar222._8_4_ + iVar115 + auVar215._8_4_ >> auVar217;
  iStack_13c = auVar222._12_4_ + iVar115 + auVar215._12_4_ >> auVar217;
  auVar215 = pmulld(auVar61,local_508);
  local_138 = auVar215._0_4_ + iVar115 + auVar162._0_4_ >> auVar217;
  iStack_134 = auVar215._4_4_ + iVar115 + auVar162._4_4_ >> auVar217;
  iStack_130 = auVar215._8_4_ + iVar115 + auVar162._8_4_ >> auVar217;
  iStack_12c = auVar215._12_4_ + iVar115 + auVar162._12_4_ >> auVar217;
  iVar116 = *(int *)((long)vert_filter_length_chroma + lVar109 + 0x180);
  auVar215 = pmulld(auVar51,auVar137);
  auVar157._4_4_ = iVar116;
  auVar157._0_4_ = iVar116;
  auVar157._8_4_ = iVar116;
  auVar157._12_4_ = iVar116;
  iVar116 = -iVar116;
  auVar162 = pmulld(auVar80,auVar171);
  iVar145 = *(int *)((long)vert_filter_length_chroma + lVar109 + 0x200);
  local_108 = auVar162._0_4_ + iVar115 + auVar215._0_4_ >> auVar217;
  iStack_104 = auVar162._4_4_ + iVar115 + auVar215._4_4_ >> auVar217;
  iStack_100 = auVar162._8_4_ + iVar115 + auVar215._8_4_ >> auVar217;
  iStack_fc = auVar162._12_4_ + iVar115 + auVar215._12_4_ >> auVar217;
  iVar121 = -iVar145;
  auVar162 = pmulld(auVar48,auVar171);
  iVar120 = *(int *)((long)vert_filter_length_chroma + lVar109 + 0x240);
  local_568._0_4_ = auVar154._0_4_;
  local_568._4_4_ = auVar154._4_4_;
  local_568._8_4_ = auVar154._8_4_;
  local_568._12_4_ = auVar154._12_4_;
  iVar113 = -iVar120;
  local_f8 = auVar162._0_4_ + iVar115 + local_568._0_4_ >> auVar217;
  iStack_f4 = auVar162._4_4_ + iVar115 + local_568._4_4_ >> auVar217;
  iStack_f0 = auVar162._8_4_ + iVar115 + local_568._8_4_ >> auVar217;
  iStack_ec = auVar162._12_4_ + iVar115 + local_568._12_4_ >> auVar217;
  iVar112 = *(int *)((long)vert_filter_length_chroma + lVar109 + 0x1c0);
  local_1c8 = auVar178._0_4_ + iVar115 + auVar166._0_4_ >> auVar217;
  iStack_1c4 = auVar178._4_4_ + iVar115 + auVar166._4_4_ >> auVar217;
  iStack_1c0 = auVar178._8_4_ + iVar115 + auVar166._8_4_ >> auVar217;
  iStack_1bc = auVar178._12_4_ + iVar115 + auVar166._12_4_ >> auVar217;
  auVar210._4_4_ = iVar112;
  auVar210._0_4_ = iVar112;
  auVar210._8_4_ = iVar112;
  auVar210._12_4_ = iVar112;
  auVar181._4_4_ = iVar120;
  auVar181._0_4_ = iVar120;
  auVar181._8_4_ = iVar120;
  auVar181._12_4_ = iVar120;
  auVar191._4_4_ = iVar116;
  auVar191._0_4_ = iVar116;
  auVar191._8_4_ = iVar116;
  auVar191._12_4_ = iVar116;
  auVar223._4_4_ = iVar121;
  auVar223._0_4_ = iVar121;
  auVar223._8_4_ = iVar121;
  auVar223._12_4_ = iVar121;
  auVar172._4_4_ = iVar113;
  auVar172._0_4_ = iVar113;
  auVar172._8_4_ = iVar113;
  auVar172._12_4_ = iVar113;
  local_1b8 = auVar134._0_4_ + iVar115 + auVar151._0_4_ >> auVar217;
  iStack_1b4 = auVar134._4_4_ + iVar115 + auVar151._4_4_ >> auVar217;
  iStack_1b0 = auVar134._8_4_ + iVar115 + auVar151._8_4_ >> auVar217;
  iStack_1ac = auVar134._12_4_ + iVar115 + auVar151._12_4_ >> auVar217;
  local_188 = auVar167._0_4_ + iVar115 + auVar180._0_4_ >> auVar217;
  iStack_184 = auVar167._4_4_ + iVar115 + auVar180._4_4_ >> auVar217;
  iStack_180 = auVar167._8_4_ + iVar115 + auVar180._8_4_ >> auVar217;
  iStack_17c = auVar167._12_4_ + iVar115 + auVar180._12_4_ >> auVar217;
  local_178 = auVar214._0_4_ + iVar115 + auVar185._0_4_ >> auVar217;
  iStack_174 = auVar214._4_4_ + iVar115 + auVar185._4_4_ >> auVar217;
  iStack_170 = auVar214._8_4_ + iVar115 + auVar185._8_4_ >> auVar217;
  iStack_16c = auVar214._12_4_ + iVar115 + auVar185._12_4_ >> auVar217;
  auVar134._12_4_ = iStack_40c;
  auVar134._0_12_ = *(undefined1 (*) [12])in[8];
  auVar185 = pmulld(auVar134,auVar157);
  local_3e8[0] = auVar185._0_4_ + iVar115 >> auVar217;
  local_3e8[1] = auVar185._4_4_ + iVar115 >> auVar217;
  local_3e8[2] = auVar185._8_4_ + iVar115 >> auVar217;
  local_3e8[3] = auVar185._12_4_ + iVar115 >> auVar217;
  auVar134 = pmulld(auVar134,auVar181);
  local_418 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_414 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_410 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_40c = auVar134._12_4_ + iVar115 >> auVar217;
  local_3c8 = local_3e8[4];
  uStack_3c4 = local_3e8[5];
  uStack_3c0 = local_3e8[6];
  uStack_3bc = uStack_3cc;
  local_3b8 = local_3a8;
  uStack_3b4 = uStack_3a4;
  uStack_3b0 = uStack_3a0;
  uStack_3ac = uStack_39c;
  local_388 = local_398;
  uStack_384 = uStack_394;
  uStack_380 = uStack_390;
  uStack_37c = uStack_38c;
  local_378 = local_368[0];
  uStack_374 = local_368[1];
  uStack_370 = local_368[2];
  uStack_36c = local_368[3];
  auVar162._8_4_ = local_368[6];
  auVar162._0_8_ = local_4a8;
  auVar162._12_4_ = local_368[7];
  auVar166._4_4_ = iStack_324;
  auVar166._0_4_ = local_328;
  auVar166._8_4_ = iStack_320;
  auVar166._12_4_ = iStack_31c;
  auVar134 = pmulld(auVar162,auVar191);
  auVar32._8_4_ = local_268[2];
  auVar32._0_8_ = local_4d8;
  auVar32._12_4_ = local_268[3];
  auVar167 = pmulld(auVar32,auVar181);
  auVar182 = pmulld(auVar166,auVar172);
  auVar30._4_4_ = iStack_294;
  auVar30._0_4_ = local_298;
  auVar30._8_4_ = iStack_290;
  auVar30._12_4_ = iStack_28c;
  auVar185 = pmulld(auVar30,auVar191);
  auVar178._4_4_ = iStack_314;
  auVar178._0_4_ = local_318;
  auVar178._8_4_ = iStack_310;
  auVar178._12_4_ = iStack_30c;
  auVar151 = pmulld(auVar178,auVar223);
  auVar222._4_4_ = iStack_2a4;
  auVar222._0_4_ = local_2a8;
  auVar222._8_4_ = iStack_2a0;
  auVar222._12_4_ = iStack_29c;
  auVar214 = pmulld(auVar222,auVar210);
  iVar112 = -iVar112;
  auVar211._4_4_ = iVar112;
  auVar211._0_4_ = iVar112;
  auVar211._8_4_ = iVar112;
  auVar211._12_4_ = iVar112;
  auVar180._4_4_ = iStack_2e4;
  auVar180._0_4_ = local_2e8;
  auVar180._8_4_ = iStack_2e0;
  auVar180._12_4_ = iStack_2dc;
  auVar216 = pmulld(auVar180,auVar211);
  auVar215._4_4_ = iStack_2d4;
  auVar215._0_4_ = local_2d8;
  auVar215._8_4_ = iStack_2d0;
  auVar215._12_4_ = iStack_2cc;
  auVar218 = pmulld(auVar215,auVar223);
  auVar154 = pmulld(auVar180,auVar223);
  auVar215 = pmulld(auVar215,auVar210);
  auVar138._4_4_ = iVar145;
  auVar138._0_4_ = iVar145;
  auVar138._8_4_ = iVar145;
  auVar138._12_4_ = iVar145;
  auVar180 = pmulld(auVar178,auVar210);
  auVar178 = pmulld(auVar222,auVar138);
  local_2c8 = auVar215._0_4_ + iVar115 + auVar154._0_4_ >> auVar217;
  iStack_2c4 = auVar215._4_4_ + iVar115 + auVar154._4_4_ >> auVar217;
  iStack_2c0 = auVar215._8_4_ + iVar115 + auVar154._8_4_ >> auVar217;
  iStack_2bc = auVar215._12_4_ + iVar115 + auVar154._12_4_ >> auVar217;
  local_2b8 = auVar180._0_4_ + iVar115 + auVar178._0_4_ >> auVar217;
  iStack_2b4 = auVar180._4_4_ + iVar115 + auVar178._4_4_ >> auVar217;
  iStack_2b0 = auVar180._8_4_ + iVar115 + auVar178._8_4_ >> auVar217;
  iStack_2ac = auVar180._12_4_ + iVar115 + auVar178._12_4_ >> auVar217;
  auVar166 = pmulld(auVar166,auVar191);
  auVar154 = pmulld(auVar30,auVar181);
  local_288 = auVar154._0_4_ + iVar115 + auVar166._0_4_ >> auVar217;
  iStack_284 = auVar154._4_4_ + iVar115 + auVar166._4_4_ >> auVar217;
  iStack_280 = auVar154._8_4_ + iVar115 + auVar166._8_4_ >> auVar217;
  iStack_27c = auVar154._12_4_ + iVar115 + auVar166._12_4_ >> auVar217;
  iVar121 = -iVar117;
  auVar154 = pmulld(auVar162,auVar181);
  auVar162 = pmulld(auVar32,auVar157);
  iVar117 = iVar117 + -1;
  local_278 = auVar154._0_4_ + iVar115 + auVar162._0_4_ >> auVar217;
  iStack_274 = auVar154._4_4_ + iVar115 + auVar162._4_4_ >> auVar217;
  iStack_270 = auVar154._8_4_ + iVar115 + auVar162._8_4_ >> auVar217;
  iStack_26c = auVar154._12_4_ + iVar115 + auVar162._12_4_ >> auVar217;
  iVar116 = *(int *)((long)vert_filter_length_chroma + lVar109 + 0x1a0);
  iVar145 = *(int *)((long)vert_filter_length_chroma + lVar109 + 0x1e0);
  iVar120 = *(int *)((long)vert_filter_length_chroma + lVar109 + 0x220);
  local_368[8] = auVar167._0_4_ + iVar115 + auVar134._0_4_ >> auVar217;
  local_368[9] = auVar167._4_4_ + iVar115 + auVar134._4_4_ >> auVar217;
  local_368[10] = auVar167._8_4_ + iVar115 + auVar134._8_4_ >> auVar217;
  iStack_33c = auVar167._12_4_ + iVar115 + auVar134._12_4_ >> auVar217;
  local_338 = auVar182._0_4_ + iVar115 + auVar185._0_4_ >> auVar217;
  iStack_334 = auVar182._4_4_ + iVar115 + auVar185._4_4_ >> auVar217;
  iStack_330 = auVar182._8_4_ + iVar115 + auVar185._8_4_ >> auVar217;
  iStack_32c = auVar182._12_4_ + iVar115 + auVar185._12_4_ >> auVar217;
  local_308 = auVar214._0_4_ + iVar115 + auVar151._0_4_ >> auVar217;
  iStack_304 = auVar214._4_4_ + iVar115 + auVar151._4_4_ >> auVar217;
  iStack_300 = auVar214._8_4_ + iVar115 + auVar151._8_4_ >> auVar217;
  iStack_2fc = auVar214._12_4_ + iVar115 + auVar151._12_4_ >> auVar217;
  iVar113 = -iVar116;
  local_2f8 = auVar216._0_4_ + iVar115 + auVar218._0_4_ >> auVar217;
  iStack_2f4 = auVar216._4_4_ + iVar115 + auVar218._4_4_ >> auVar217;
  iStack_2f0 = auVar216._8_4_ + iVar115 + auVar218._8_4_ >> auVar217;
  iStack_2ec = auVar216._12_4_ + iVar115 + auVar218._12_4_ >> auVar217;
  iVar118 = -iVar145;
  iVar112 = -iVar120;
  uVar110 = 0x18;
  do {
    iVar196 = puVar108[-0x10] + puVar108[-0x1c];
    iVar202 = puVar108[-0xf] + puVar108[-0x1b];
    iVar204 = puVar108[-0xe] + puVar108[-0x1a];
    iVar206 = puVar108[-0xd] + puVar108[-0x19];
    iVar131 = puVar108[-0x1c] - puVar108[-0x10];
    iVar143 = puVar108[-0x1b] - puVar108[-0xf];
    iVar146 = puVar108[-0x1a] - puVar108[-0xe];
    iVar148 = puVar108[-0x19] - puVar108[-0xd];
    uVar197 = (uint)(iVar196 < iVar121) * iVar121 | (uint)(iVar196 >= iVar121) * iVar196;
    uVar203 = (uint)(iVar202 < iVar121) * iVar121 | (uint)(iVar202 >= iVar121) * iVar202;
    uVar205 = (uint)(iVar204 < iVar121) * iVar121 | (uint)(iVar204 >= iVar121) * iVar204;
    uVar207 = (uint)(iVar206 < iVar121) * iVar121 | (uint)(iVar206 >= iVar121) * iVar206;
    uVar132 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
    uVar144 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
    uVar147 = (uint)(iVar146 < iVar121) * iVar121 | (uint)(iVar146 >= iVar121) * iVar146;
    uVar149 = (uint)(iVar148 < iVar121) * iVar121 | (uint)(iVar148 >= iVar121) * iVar148;
    puVar108[-0x1c] = (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197
    ;
    puVar108[-0x1b] = (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203
    ;
    puVar108[-0x1a] = (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205
    ;
    puVar108[-0x19] = (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207
    ;
    puVar108[-0x10] = (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132
    ;
    puVar108[-0xf] = (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
    puVar108[-0xe] = (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
    puVar108[-0xd] = (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
    iVar131 = puVar108[-0x14] + puVar108[-0x18];
    iVar143 = puVar108[-0x13] + puVar108[-0x17];
    iVar146 = puVar108[-0x12] + puVar108[-0x16];
    iVar148 = puVar108[-0x11] + puVar108[-0x15];
    iVar196 = puVar108[-0x18] - puVar108[-0x14];
    iVar202 = puVar108[-0x17] - puVar108[-0x13];
    iVar204 = puVar108[-0x16] - puVar108[-0x12];
    iVar206 = puVar108[-0x15] - puVar108[-0x11];
    uVar132 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
    uVar144 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
    uVar147 = (uint)(iVar146 < iVar121) * iVar121 | (uint)(iVar146 >= iVar121) * iVar146;
    uVar149 = (uint)(iVar148 < iVar121) * iVar121 | (uint)(iVar148 >= iVar121) * iVar148;
    uVar197 = (uint)(iVar196 < iVar121) * iVar121 | (uint)(iVar196 >= iVar121) * iVar196;
    uVar203 = (uint)(iVar202 < iVar121) * iVar121 | (uint)(iVar202 >= iVar121) * iVar202;
    uVar205 = (uint)(iVar204 < iVar121) * iVar121 | (uint)(iVar204 >= iVar121) * iVar204;
    uVar207 = (uint)(iVar206 < iVar121) * iVar121 | (uint)(iVar206 >= iVar121) * iVar206;
    puVar108[-0x18] = (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132
    ;
    puVar108[-0x17] = (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144
    ;
    puVar108[-0x16] = (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147
    ;
    puVar108[-0x15] = (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149
    ;
    puVar108[-0x14] = (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197
    ;
    puVar108[-0x13] = (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203
    ;
    puVar108[-0x12] = (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205
    ;
    puVar108[-0x11] = (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207
    ;
    iVar196 = puVar108[-0xc] + *puVar108;
    iVar202 = puVar108[-0xb] + puVar108[1];
    iVar204 = puVar108[-10] + puVar108[2];
    iVar206 = puVar108[-9] + puVar108[3];
    iVar131 = *puVar108 - puVar108[-0xc];
    iVar143 = puVar108[1] - puVar108[-0xb];
    iVar146 = puVar108[2] - puVar108[-10];
    iVar148 = puVar108[3] - puVar108[-9];
    uVar197 = (uint)(iVar196 < iVar121) * iVar121 | (uint)(iVar196 >= iVar121) * iVar196;
    uVar203 = (uint)(iVar202 < iVar121) * iVar121 | (uint)(iVar202 >= iVar121) * iVar202;
    uVar205 = (uint)(iVar204 < iVar121) * iVar121 | (uint)(iVar204 >= iVar121) * iVar204;
    uVar207 = (uint)(iVar206 < iVar121) * iVar121 | (uint)(iVar206 >= iVar121) * iVar206;
    uVar132 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
    uVar144 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
    uVar147 = (uint)(iVar146 < iVar121) * iVar121 | (uint)(iVar146 >= iVar121) * iVar146;
    uVar149 = (uint)(iVar148 < iVar121) * iVar121 | (uint)(iVar148 >= iVar121) * iVar148;
    *puVar108 = (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
    puVar108[1] = (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
    puVar108[2] = (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
    puVar108[3] = (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
    puVar108[-0xc] = (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
    puVar108[-0xb] = (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
    puVar108[-10] = (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
    puVar108[-9] = (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
    iVar196 = puVar108[-8] + puVar108[-4];
    iVar202 = puVar108[-7] + puVar108[-3];
    iVar204 = puVar108[-6] + puVar108[-2];
    iVar206 = puVar108[-5] + puVar108[-1];
    iVar131 = puVar108[-4] - puVar108[-8];
    iVar143 = puVar108[-3] - puVar108[-7];
    iVar146 = puVar108[-2] - puVar108[-6];
    iVar148 = puVar108[-1] - puVar108[-5];
    uVar197 = (uint)(iVar196 < iVar121) * iVar121 | (uint)(iVar196 >= iVar121) * iVar196;
    uVar203 = (uint)(iVar202 < iVar121) * iVar121 | (uint)(iVar202 >= iVar121) * iVar202;
    uVar205 = (uint)(iVar204 < iVar121) * iVar121 | (uint)(iVar204 >= iVar121) * iVar204;
    uVar207 = (uint)(iVar206 < iVar121) * iVar121 | (uint)(iVar206 >= iVar121) * iVar206;
    uVar132 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
    uVar144 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
    uVar147 = (uint)(iVar146 < iVar121) * iVar121 | (uint)(iVar146 >= iVar121) * iVar146;
    uVar149 = (uint)(iVar148 < iVar121) * iVar121 | (uint)(iVar148 >= iVar121) * iVar148;
    puVar108[-4] = (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
    puVar108[-3] = (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
    puVar108[-2] = (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
    puVar108[-1] = (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
    puVar108[-8] = (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
    puVar108[-7] = (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
    puVar108[-6] = (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
    puVar108[-5] = (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
    uVar110 = uVar110 + 8;
    puVar108 = puVar108 + 0x20;
  } while (uVar110 < 0x38);
  auVar219._4_4_ = iVar116;
  auVar219._0_4_ = iVar116;
  auVar219._8_4_ = iVar116;
  auVar219._12_4_ = iVar116;
  auVar126._4_4_ = iVar145;
  auVar126._0_4_ = iVar145;
  auVar126._8_4_ = iVar145;
  auVar126._12_4_ = iVar145;
  auVar192._4_4_ = iVar120;
  auVar192._0_4_ = iVar120;
  auVar192._8_4_ = iVar120;
  auVar192._12_4_ = iVar120;
  auVar201._4_4_ = iVar113;
  auVar201._0_4_ = iVar113;
  auVar201._8_4_ = iVar113;
  auVar201._12_4_ = iVar113;
  puVar108 = &local_2e8;
  auVar4._12_4_ = local_458[3];
  auVar4._0_12_ = auVar99;
  auVar134 = pmulld(auVar4,auVar126);
  local_458[4] = auVar134._0_4_ + iVar115 >> auVar217;
  local_458[5] = auVar134._4_4_ + iVar115 >> auVar217;
  local_458[6] = auVar134._8_4_ + iVar115 >> auVar217;
  local_458[7] = auVar134._12_4_ + iVar115 >> auVar217;
  local_458[0] = local_458[4];
  local_458[1] = local_458[5];
  local_458[2] = local_458[6];
  local_458[3] = local_458[7];
  auVar7._4_4_ = local_3e8[5];
  auVar7._0_4_ = local_3e8[4];
  auVar7._8_4_ = local_3e8[6];
  auVar7._12_4_ = uStack_3cc;
  auVar8._4_4_ = uStack_3a4;
  auVar8._0_4_ = local_3a8;
  auVar8._8_4_ = uStack_3a0;
  auVar8._12_4_ = uStack_39c;
  local_408 = local_418;
  iStack_404 = iStack_414;
  iStack_400 = iStack_410;
  iStack_3fc = iStack_40c;
  local_3f8 = local_3e8[0];
  iStack_3f4 = local_3e8[1];
  iStack_3f0 = local_3e8[2];
  iStack_3ec = local_3e8[3];
  auVar134 = pmulld(auVar7,auVar201);
  auVar14._4_4_ = local_368[1];
  auVar14._0_4_ = local_368[0];
  auVar14._8_4_ = local_368[2];
  auVar14._12_4_ = local_368[3];
  auVar185 = pmulld(auVar14,auVar192);
  local_3c8 = auVar134._0_4_ + iVar115 + auVar185._0_4_ >> auVar217;
  uStack_3c4 = auVar134._4_4_ + iVar115 + auVar185._4_4_ >> auVar217;
  uStack_3c0 = auVar134._8_4_ + iVar115 + auVar185._8_4_ >> auVar217;
  uStack_3bc = auVar134._12_4_ + iVar115 + auVar185._12_4_ >> auVar217;
  auVar183._4_4_ = iVar112;
  auVar183._0_4_ = iVar112;
  auVar183._8_4_ = iVar112;
  auVar183._12_4_ = iVar112;
  auVar185 = pmulld(auVar7,auVar192);
  auVar134 = pmulld(auVar14,auVar219);
  local_378 = auVar185._0_4_ + iVar115 + auVar134._0_4_ >> auVar217;
  uStack_374 = auVar185._4_4_ + iVar115 + auVar134._4_4_ >> auVar217;
  uStack_370 = auVar185._8_4_ + iVar115 + auVar134._8_4_ >> auVar217;
  uStack_36c = auVar185._12_4_ + iVar115 + auVar134._12_4_ >> auVar217;
  auVar134 = pmulld(auVar8,auVar183);
  auVar12._4_4_ = uStack_394;
  auVar12._0_4_ = local_398;
  auVar12._8_4_ = uStack_390;
  auVar12._12_4_ = uStack_38c;
  auVar185 = pmulld(auVar12,auVar201);
  local_3b8 = auVar134._0_4_ + iVar115 + auVar185._0_4_ >> auVar217;
  uStack_3b4 = auVar134._4_4_ + iVar115 + auVar185._4_4_ >> auVar217;
  uStack_3b0 = auVar134._8_4_ + iVar115 + auVar185._8_4_ >> auVar217;
  uStack_3ac = auVar134._12_4_ + iVar115 + auVar185._12_4_ >> auVar217;
  auVar134 = pmulld(auVar8,auVar201);
  auVar185 = pmulld(auVar12,auVar192);
  local_388 = auVar134._0_4_ + iVar115 + auVar185._0_4_ >> auVar217;
  uStack_384 = auVar134._4_4_ + iVar115 + auVar185._4_4_ >> auVar217;
  uStack_380 = auVar134._8_4_ + iVar115 + auVar185._8_4_ >> auVar217;
  uStack_37c = auVar134._12_4_ + iVar115 + auVar185._12_4_ >> auVar217;
  uVar110 = 8;
  do {
    iVar113 = puVar108[-0x10] + puVar108[-0x1c];
    iVar131 = puVar108[-0xf] + puVar108[-0x1b];
    iVar143 = puVar108[-0xe] + puVar108[-0x1a];
    iVar146 = puVar108[-0xd] + puVar108[-0x19];
    iVar116 = puVar108[-0x1c] - puVar108[-0x10];
    iVar145 = puVar108[-0x1b] - puVar108[-0xf];
    iVar120 = puVar108[-0x1a] - puVar108[-0xe];
    iVar112 = puVar108[-0x19] - puVar108[-0xd];
    uVar197 = (uint)(iVar113 < iVar121) * iVar121 | (uint)(iVar113 >= iVar121) * iVar113;
    uVar203 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
    uVar205 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
    uVar207 = (uint)(iVar146 < iVar121) * iVar121 | (uint)(iVar146 >= iVar121) * iVar146;
    uVar132 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
    uVar144 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
    uVar147 = (uint)(iVar120 < iVar121) * iVar121 | (uint)(iVar120 >= iVar121) * iVar120;
    uVar149 = (uint)(iVar112 < iVar121) * iVar121 | (uint)(iVar112 >= iVar121) * iVar112;
    puVar108[-0x1c] = (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197
    ;
    puVar108[-0x1b] = (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203
    ;
    puVar108[-0x1a] = (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205
    ;
    puVar108[-0x19] = (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207
    ;
    puVar108[-0x10] = (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132
    ;
    puVar108[-0xf] = (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
    puVar108[-0xe] = (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
    puVar108[-0xd] = (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
    iVar116 = puVar108[-0x14] + puVar108[-0x18];
    iVar145 = puVar108[-0x13] + puVar108[-0x17];
    iVar120 = puVar108[-0x12] + puVar108[-0x16];
    iVar112 = puVar108[-0x11] + puVar108[-0x15];
    iVar113 = puVar108[-0x18] - puVar108[-0x14];
    iVar131 = puVar108[-0x17] - puVar108[-0x13];
    iVar143 = puVar108[-0x16] - puVar108[-0x12];
    iVar146 = puVar108[-0x15] - puVar108[-0x11];
    uVar132 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
    uVar144 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
    uVar147 = (uint)(iVar120 < iVar121) * iVar121 | (uint)(iVar120 >= iVar121) * iVar120;
    uVar149 = (uint)(iVar112 < iVar121) * iVar121 | (uint)(iVar112 >= iVar121) * iVar112;
    uVar197 = (uint)(iVar113 < iVar121) * iVar121 | (uint)(iVar113 >= iVar121) * iVar113;
    uVar203 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
    uVar205 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
    uVar207 = (uint)(iVar146 < iVar121) * iVar121 | (uint)(iVar146 >= iVar121) * iVar146;
    puVar108[-0x18] = (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132
    ;
    puVar108[-0x17] = (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144
    ;
    puVar108[-0x16] = (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147
    ;
    puVar108[-0x15] = (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149
    ;
    puVar108[-0x14] = (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197
    ;
    puVar108[-0x13] = (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203
    ;
    puVar108[-0x12] = (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205
    ;
    puVar108[-0x11] = (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207
    ;
    iVar113 = puVar108[-0xc] + *puVar108;
    iVar131 = puVar108[-0xb] + puVar108[1];
    iVar143 = puVar108[-10] + puVar108[2];
    iVar146 = puVar108[-9] + puVar108[3];
    iVar116 = *puVar108 - puVar108[-0xc];
    iVar145 = puVar108[1] - puVar108[-0xb];
    iVar120 = puVar108[2] - puVar108[-10];
    iVar112 = puVar108[3] - puVar108[-9];
    uVar197 = (uint)(iVar113 < iVar121) * iVar121 | (uint)(iVar113 >= iVar121) * iVar113;
    uVar203 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
    uVar205 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
    uVar207 = (uint)(iVar146 < iVar121) * iVar121 | (uint)(iVar146 >= iVar121) * iVar146;
    uVar132 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
    uVar144 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
    uVar147 = (uint)(iVar120 < iVar121) * iVar121 | (uint)(iVar120 >= iVar121) * iVar120;
    uVar149 = (uint)(iVar112 < iVar121) * iVar121 | (uint)(iVar112 >= iVar121) * iVar112;
    *puVar108 = (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
    puVar108[1] = (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
    puVar108[2] = (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
    puVar108[3] = (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
    puVar108[-0xc] = (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
    puVar108[-0xb] = (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
    puVar108[-10] = (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
    puVar108[-9] = (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
    iVar113 = puVar108[-8] + puVar108[-4];
    iVar131 = puVar108[-7] + puVar108[-3];
    iVar143 = puVar108[-6] + puVar108[-2];
    iVar146 = puVar108[-5] + puVar108[-1];
    iVar116 = puVar108[-4] - puVar108[-8];
    iVar145 = puVar108[-3] - puVar108[-7];
    iVar120 = puVar108[-2] - puVar108[-6];
    iVar112 = puVar108[-1] - puVar108[-5];
    uVar197 = (uint)(iVar113 < iVar121) * iVar121 | (uint)(iVar113 >= iVar121) * iVar113;
    uVar203 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
    uVar205 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
    uVar207 = (uint)(iVar146 < iVar121) * iVar121 | (uint)(iVar146 >= iVar121) * iVar146;
    uVar132 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
    uVar144 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
    uVar147 = (uint)(iVar120 < iVar121) * iVar121 | (uint)(iVar120 >= iVar121) * iVar120;
    uVar149 = (uint)(iVar112 < iVar121) * iVar121 | (uint)(iVar112 >= iVar121) * iVar112;
    puVar108[-4] = (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
    puVar108[-3] = (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
    puVar108[-2] = (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
    puVar108[-1] = (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
    puVar108[-8] = (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
    puVar108[-7] = (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
    puVar108[-6] = (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
    puVar108[-5] = (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
    uVar110 = uVar110 + 8;
    puVar108 = puVar108 + 0x20;
  } while (uVar110 < 0x18);
  puVar108 = local_268 + 4;
  auVar34._4_4_ = iStack_234;
  auVar34._0_4_ = local_238;
  auVar34._8_4_ = iStack_230;
  auVar34._12_4_ = iStack_22c;
  auVar35._4_4_ = iStack_224;
  auVar35._0_4_ = local_228;
  auVar35._8_4_ = iStack_220;
  auVar35._12_4_ = iStack_21c;
  auVar167 = pmulld(auVar34,auVar191);
  auVar98._4_4_ = iStack_84;
  auVar98._0_4_ = local_88;
  auVar98._8_4_ = iStack_80;
  auVar98._12_4_ = iStack_7c;
  auVar185 = pmulld(auVar98,auVar181);
  auVar222 = pmulld(auVar35,auVar191);
  auVar97._4_4_ = iStack_94;
  auVar97._0_4_ = local_98;
  auVar97._8_4_ = iStack_90;
  auVar97._12_4_ = iStack_8c;
  auVar151 = pmulld(auVar97,auVar181);
  auVar37._4_4_ = iStack_214;
  auVar37._0_4_ = local_218;
  auVar37._8_4_ = iStack_210;
  auVar37._12_4_ = iStack_20c;
  auVar178 = pmulld(auVar37,auVar172);
  auVar94._4_4_ = iStack_a4;
  auVar94._0_4_ = local_a8;
  auVar94._8_4_ = iStack_a0;
  auVar94._12_4_ = iStack_9c;
  auVar154 = pmulld(auVar94,auVar191);
  auVar40._4_4_ = iStack_204;
  auVar40._0_4_ = local_208;
  auVar40._8_4_ = iStack_200;
  auVar40._12_4_ = iStack_1fc;
  auVar214 = pmulld(auVar172,auVar40);
  auVar92._4_4_ = iStack_b4;
  auVar92._0_4_ = local_b8;
  auVar92._8_4_ = iStack_b0;
  auVar92._12_4_ = iStack_ac;
  auVar180 = pmulld(auVar92,auVar191);
  auVar162 = pmulld(auVar40,auVar191);
  auVar134 = pmulld(auVar92,auVar181);
  local_b8 = auVar162._0_4_ + iVar115 + auVar134._0_4_ >> auVar217;
  iStack_b4 = auVar162._4_4_ + iVar115 + auVar134._4_4_ >> auVar217;
  iStack_b0 = auVar162._8_4_ + iVar115 + auVar134._8_4_ >> auVar217;
  iStack_ac = auVar162._12_4_ + iVar115 + auVar134._12_4_ >> auVar217;
  auVar134 = pmulld(auVar37,auVar191);
  auVar162 = pmulld(auVar94,auVar181);
  local_a8 = auVar134._0_4_ + iVar115 + auVar162._0_4_ >> auVar217;
  iStack_a4 = auVar134._4_4_ + iVar115 + auVar162._4_4_ >> auVar217;
  iStack_a0 = auVar134._8_4_ + iVar115 + auVar162._8_4_ >> auVar217;
  iStack_9c = auVar134._12_4_ + iVar115 + auVar162._12_4_ >> auVar217;
  auVar166 = pmulld(auVar35,auVar181);
  auVar134 = pmulld(auVar97,auVar157);
  auVar215 = pmulld(auVar34,auVar181);
  auVar162 = pmulld(auVar98,auVar157);
  local_98 = auVar166._0_4_ + iVar115 + auVar134._0_4_ >> auVar217;
  iStack_94 = auVar166._4_4_ + iVar115 + auVar134._4_4_ >> auVar217;
  iStack_90 = auVar166._8_4_ + iVar115 + auVar134._8_4_ >> auVar217;
  iStack_8c = auVar166._12_4_ + iVar115 + auVar134._12_4_ >> auVar217;
  local_88 = auVar215._0_4_ + iVar115 + auVar162._0_4_ >> auVar217;
  iStack_84 = auVar215._4_4_ + iVar115 + auVar162._4_4_ >> auVar217;
  iStack_80 = auVar215._8_4_ + iVar115 + auVar162._8_4_ >> auVar217;
  iStack_7c = auVar215._12_4_ + iVar115 + auVar162._12_4_ >> auVar217;
  local_238 = auVar167._0_4_ + iVar115 + auVar185._0_4_ >> auVar217;
  iStack_234 = auVar167._4_4_ + iVar115 + auVar185._4_4_ >> auVar217;
  iStack_230 = auVar167._8_4_ + iVar115 + auVar185._8_4_ >> auVar217;
  iStack_22c = auVar167._12_4_ + iVar115 + auVar185._12_4_ >> auVar217;
  local_228 = auVar222._0_4_ + iVar115 + auVar151._0_4_ >> auVar217;
  iStack_224 = auVar222._4_4_ + iVar115 + auVar151._4_4_ >> auVar217;
  iStack_220 = auVar222._8_4_ + iVar115 + auVar151._8_4_ >> auVar217;
  iStack_21c = auVar222._12_4_ + iVar115 + auVar151._12_4_ >> auVar217;
  local_218 = auVar178._0_4_ + iVar115 + auVar154._0_4_ >> auVar217;
  iStack_214 = auVar178._4_4_ + iVar115 + auVar154._4_4_ >> auVar217;
  iStack_210 = auVar178._8_4_ + iVar115 + auVar154._8_4_ >> auVar217;
  iStack_20c = auVar178._12_4_ + iVar115 + auVar154._12_4_ >> auVar217;
  local_208 = auVar214._0_4_ + iVar115 + auVar180._0_4_ >> auVar217;
  iStack_204 = auVar214._4_4_ + iVar115 + auVar180._4_4_ >> auVar217;
  iStack_200 = auVar214._8_4_ + iVar115 + auVar180._8_4_ >> auVar217;
  iStack_1fc = auVar214._12_4_ + iVar115 + auVar180._12_4_ >> auVar217;
  auVar52._4_4_ = iStack_1b4;
  auVar52._0_4_ = local_1b8;
  auVar52._8_4_ = iStack_1b0;
  auVar52._12_4_ = iStack_1ac;
  auVar178 = pmulld(auVar52,auVar223);
  auVar81._4_4_ = iStack_104;
  auVar81._0_4_ = local_108;
  auVar81._8_4_ = iStack_100;
  auVar81._12_4_ = iStack_fc;
  auVar134 = pmulld(auVar81,auVar210);
  auVar55._4_4_ = iStack_1a4;
  auVar55._0_4_ = local_1a8;
  auVar55._8_4_ = iStack_1a0;
  auVar55._12_4_ = iStack_19c;
  auVar167 = pmulld(auVar55,auVar223);
  auVar77._4_4_ = iStack_114;
  auVar77._0_4_ = local_118;
  auVar77._8_4_ = iStack_110;
  auVar77._12_4_ = iStack_10c;
  auVar185 = pmulld(auVar77,auVar210);
  auVar59._4_4_ = iStack_194;
  auVar59._0_4_ = local_198;
  auVar59._8_4_ = iStack_190;
  auVar59._12_4_ = iStack_18c;
  auVar222 = pmulld(auVar59,auVar211);
  auVar74._4_4_ = iStack_124;
  auVar74._0_4_ = local_128;
  auVar74._8_4_ = iStack_120;
  auVar74._12_4_ = iStack_11c;
  auVar151 = pmulld(auVar74,auVar223);
  auVar62._4_4_ = iStack_184;
  auVar62._0_4_ = local_188;
  auVar62._8_4_ = iStack_180;
  auVar62._12_4_ = iStack_17c;
  auVar166 = pmulld(auVar211,auVar62);
  auVar72._4_4_ = iStack_134;
  auVar72._0_4_ = local_138;
  auVar72._8_4_ = iStack_130;
  auVar72._12_4_ = iStack_12c;
  auVar180 = pmulld(auVar72,auVar223);
  auVar154 = pmulld(auVar62,auVar223);
  auVar162 = pmulld(auVar72,auVar210);
  local_138 = auVar154._0_4_ + iVar115 + auVar162._0_4_ >> auVar217;
  iStack_134 = auVar154._4_4_ + iVar115 + auVar162._4_4_ >> auVar217;
  iStack_130 = auVar154._8_4_ + iVar115 + auVar162._8_4_ >> auVar217;
  iStack_12c = auVar154._12_4_ + iVar115 + auVar162._12_4_ >> auVar217;
  auVar154 = pmulld(auVar59,auVar223);
  auVar188._4_4_ = iVar118;
  auVar188._0_4_ = iVar118;
  auVar188._8_4_ = iVar118;
  auVar188._12_4_ = iVar118;
  auVar162 = pmulld(auVar74,auVar210);
  local_128 = auVar154._0_4_ + iVar115 + auVar162._0_4_ >> auVar217;
  iStack_124 = auVar154._4_4_ + iVar115 + auVar162._4_4_ >> auVar217;
  iStack_120 = auVar154._8_4_ + iVar115 + auVar162._8_4_ >> auVar217;
  iStack_11c = auVar154._12_4_ + iVar115 + auVar162._12_4_ >> auVar217;
  auVar215 = pmulld(auVar55,auVar210);
  auVar154 = pmulld(auVar77,auVar138);
  auVar214 = pmulld(auVar52,auVar210);
  auVar162 = pmulld(auVar81,auVar138);
  local_118 = auVar215._0_4_ + iVar115 + auVar154._0_4_ >> auVar217;
  iStack_114 = auVar215._4_4_ + iVar115 + auVar154._4_4_ >> auVar217;
  iStack_110 = auVar215._8_4_ + iVar115 + auVar154._8_4_ >> auVar217;
  iStack_10c = auVar215._12_4_ + iVar115 + auVar154._12_4_ >> auVar217;
  local_108 = auVar214._0_4_ + iVar115 + auVar162._0_4_ >> auVar217;
  iStack_104 = auVar214._4_4_ + iVar115 + auVar162._4_4_ >> auVar217;
  iStack_100 = auVar214._8_4_ + iVar115 + auVar162._8_4_ >> auVar217;
  iStack_fc = auVar214._12_4_ + iVar115 + auVar162._12_4_ >> auVar217;
  local_1b8 = auVar178._0_4_ + iVar115 + auVar134._0_4_ >> auVar217;
  iStack_1b4 = auVar178._4_4_ + iVar115 + auVar134._4_4_ >> auVar217;
  iStack_1b0 = auVar178._8_4_ + iVar115 + auVar134._8_4_ >> auVar217;
  iStack_1ac = auVar178._12_4_ + iVar115 + auVar134._12_4_ >> auVar217;
  local_1a8 = auVar167._0_4_ + iVar115 + auVar185._0_4_ >> auVar217;
  iStack_1a4 = auVar167._4_4_ + iVar115 + auVar185._4_4_ >> auVar217;
  iStack_1a0 = auVar167._8_4_ + iVar115 + auVar185._8_4_ >> auVar217;
  iStack_19c = auVar167._12_4_ + iVar115 + auVar185._12_4_ >> auVar217;
  local_198 = auVar222._0_4_ + iVar115 + auVar151._0_4_ >> auVar217;
  iStack_194 = auVar222._4_4_ + iVar115 + auVar151._4_4_ >> auVar217;
  iStack_190 = auVar222._8_4_ + iVar115 + auVar151._8_4_ >> auVar217;
  iStack_18c = auVar222._12_4_ + iVar115 + auVar151._12_4_ >> auVar217;
  local_188 = auVar166._0_4_ + iVar115 + auVar180._0_4_ >> auVar217;
  iStack_184 = auVar166._4_4_ + iVar115 + auVar180._4_4_ >> auVar217;
  iStack_180 = auVar166._8_4_ + iVar115 + auVar180._8_4_ >> auVar217;
  iStack_17c = auVar166._12_4_ + iVar115 + auVar180._12_4_ >> auVar217;
  local_428 = CONCAT44(local_458[5],local_458[4]);
  uStack_420 = CONCAT44(local_458[7],local_458[6]);
  local_438 = CONCAT44(local_458[5],local_458[4]);
  uStack_430 = CONCAT44(local_458[7],local_458[6]);
  auVar5._4_4_ = iStack_414;
  auVar5._0_4_ = local_418;
  auVar5._8_4_ = iStack_410;
  auVar5._12_4_ = iStack_40c;
  auVar6._4_4_ = local_3e8[1];
  auVar6._0_4_ = local_3e8[0];
  auVar6._8_4_ = local_3e8[2];
  auVar6._12_4_ = local_3e8[3];
  auVar139._0_4_ = local_3e8[0] + local_418;
  auVar139._4_4_ = local_3e8[1] + iStack_414;
  auVar139._8_4_ = local_3e8[2] + iStack_410;
  auVar139._12_4_ = local_3e8[3] + iStack_40c;
  auVar134 = pmulld(auVar5,auVar188);
  auVar151 = pmulld(auVar6,auVar126);
  auVar185 = pmulld(auVar139,auVar126);
  local_3f8 = auVar185._0_4_ + iVar115 >> auVar217;
  iStack_3f4 = auVar185._4_4_ + iVar115 >> auVar217;
  iStack_3f0 = auVar185._8_4_ + iVar115 >> auVar217;
  iStack_3ec = auVar185._12_4_ + iVar115 >> auVar217;
  local_408 = auVar134._0_4_ + iVar115 + auVar151._0_4_ >> auVar217;
  iStack_404 = auVar134._4_4_ + iVar115 + auVar151._4_4_ >> auVar217;
  iStack_400 = auVar134._8_4_ + iVar115 + auVar151._8_4_ >> auVar217;
  iStack_3fc = auVar134._12_4_ + iVar115 + auVar151._12_4_ >> auVar217;
  iVar113 = local_3a8 + local_3e8[4];
  iVar118 = uStack_3a4 + local_3e8[5];
  iVar131 = uStack_3a0 + local_3e8[6];
  iVar143 = uStack_39c + uStack_3cc;
  iVar116 = local_3e8[4] - local_3a8;
  iVar145 = local_3e8[5] - uStack_3a4;
  iVar120 = local_3e8[6] - uStack_3a0;
  iVar112 = uStack_3cc - uStack_39c;
  uVar197 = (uint)(iVar113 < iVar121) * iVar121 | (uint)(iVar113 >= iVar121) * iVar113;
  uVar203 = (uint)(iVar118 < iVar121) * iVar121 | (uint)(iVar118 >= iVar121) * iVar118;
  uVar205 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
  uVar207 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
  uVar132 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
  uVar144 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
  uVar147 = (uint)(iVar120 < iVar121) * iVar121 | (uint)(iVar120 >= iVar121) * iVar120;
  uVar149 = (uint)(iVar112 < iVar121) * iVar121 | (uint)(iVar112 >= iVar121) * iVar112;
  local_3e8[4] = (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
  local_3e8[5] = (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
  local_3e8[6] = (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
  uStack_3cc = (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
  local_3a8 = (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
  uStack_3a4 = (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
  uStack_3a0 = (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
  uStack_39c = (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
  iVar113 = local_3b8 + local_3c8;
  iVar118 = uStack_3b4 + uStack_3c4;
  iVar131 = uStack_3b0 + uStack_3c0;
  iVar143 = uStack_3ac + uStack_3bc;
  iVar116 = local_3c8 - local_3b8;
  iVar145 = uStack_3c4 - uStack_3b4;
  iVar120 = uStack_3c0 - uStack_3b0;
  iVar112 = uStack_3bc - uStack_3ac;
  uVar197 = (uint)(iVar113 < iVar121) * iVar121 | (uint)(iVar113 >= iVar121) * iVar113;
  uVar203 = (uint)(iVar118 < iVar121) * iVar121 | (uint)(iVar118 >= iVar121) * iVar118;
  uVar205 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
  uVar207 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
  uVar132 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
  uVar144 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
  uVar147 = (uint)(iVar120 < iVar121) * iVar121 | (uint)(iVar120 >= iVar121) * iVar120;
  uVar149 = (uint)(iVar112 < iVar121) * iVar121 | (uint)(iVar112 >= iVar121) * iVar112;
  local_3c8 = (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
  uStack_3c4 = (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
  uStack_3c0 = (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
  uStack_3bc = (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
  local_3b8 = (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
  uStack_3b4 = (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
  uStack_3b0 = (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
  uStack_3ac = (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
  iVar113 = local_398 + local_368[0];
  iVar118 = uStack_394 + local_368[1];
  iVar131 = uStack_390 + local_368[2];
  iVar143 = uStack_38c + local_368[3];
  iVar116 = local_368[0] - local_398;
  iVar145 = local_368[1] - uStack_394;
  iVar120 = local_368[2] - uStack_390;
  iVar112 = local_368[3] - uStack_38c;
  uVar197 = (uint)(iVar113 < iVar121) * iVar121 | (uint)(iVar113 >= iVar121) * iVar113;
  uVar203 = (uint)(iVar118 < iVar121) * iVar121 | (uint)(iVar118 >= iVar121) * iVar118;
  uVar205 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
  uVar207 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
  uVar132 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
  uVar144 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
  uVar147 = (uint)(iVar120 < iVar121) * iVar121 | (uint)(iVar120 >= iVar121) * iVar120;
  uVar149 = (uint)(iVar112 < iVar121) * iVar121 | (uint)(iVar112 >= iVar121) * iVar112;
  local_368[0] = (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
  local_368[1] = (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
  local_368[2] = (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
  local_368[3] = (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
  local_398 = (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
  uStack_394 = (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
  uStack_390 = (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
  uStack_38c = (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
  iVar113 = local_388 + local_378;
  iVar118 = uStack_384 + uStack_374;
  iVar131 = uStack_380 + uStack_370;
  iVar143 = uStack_37c + uStack_36c;
  iVar116 = local_378 - local_388;
  iVar145 = uStack_374 - uStack_384;
  iVar120 = uStack_370 - uStack_380;
  iVar112 = uStack_36c - uStack_37c;
  uVar197 = (uint)(iVar113 < iVar121) * iVar121 | (uint)(iVar113 >= iVar121) * iVar113;
  uVar203 = (uint)(iVar118 < iVar121) * iVar121 | (uint)(iVar118 >= iVar121) * iVar118;
  uVar205 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
  uVar207 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
  uVar132 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
  uVar144 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
  uVar147 = (uint)(iVar120 < iVar121) * iVar121 | (uint)(iVar120 >= iVar121) * iVar120;
  uVar149 = (uint)(iVar112 < iVar121) * iVar121 | (uint)(iVar112 >= iVar121) * iVar112;
  local_378 = (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
  uStack_374 = (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
  uStack_370 = (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
  uStack_36c = (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
  local_388 = (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
  uStack_384 = (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
  uStack_380 = (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
  uStack_37c = (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
  auVar15._4_4_ = iStack_334;
  auVar15._0_4_ = local_338;
  auVar15._8_4_ = iStack_330;
  auVar15._12_4_ = iStack_32c;
  auVar16._4_4_ = iStack_324;
  auVar16._0_4_ = local_328;
  auVar16._8_4_ = iStack_320;
  auVar16._12_4_ = iStack_31c;
  auVar17._4_4_ = iStack_314;
  auVar17._0_4_ = local_318;
  auVar17._8_4_ = iStack_310;
  auVar17._12_4_ = iStack_30c;
  auVar19._4_4_ = iStack_304;
  auVar19._0_4_ = local_308;
  auVar19._8_4_ = iStack_300;
  auVar19._12_4_ = iStack_2fc;
  auVar178 = pmulld(auVar15,auVar201);
  auVar31._4_4_ = iStack_284;
  auVar31._0_4_ = local_288;
  auVar31._8_4_ = iStack_280;
  auVar31._12_4_ = iStack_27c;
  auVar134 = pmulld(auVar31,auVar192);
  auVar166 = pmulld(auVar16,auVar201);
  auVar29._4_4_ = iStack_294;
  auVar29._0_4_ = local_298;
  auVar29._8_4_ = iStack_290;
  auVar29._12_4_ = iStack_28c;
  auVar185 = pmulld(auVar29,auVar192);
  auVar180 = pmulld(auVar17,auVar183);
  auVar27._4_4_ = iStack_2a4;
  auVar27._0_4_ = local_2a8;
  auVar27._8_4_ = iStack_2a0;
  auVar27._12_4_ = iStack_29c;
  auVar151 = pmulld(auVar27,auVar201);
  auVar25._4_4_ = iStack_2b4;
  auVar25._0_4_ = local_2b8;
  auVar25._8_4_ = iStack_2b0;
  auVar25._12_4_ = iStack_2ac;
  auVar167 = pmulld(auVar19,auVar201);
  auVar154 = pmulld(auVar25,auVar192);
  auVar214 = pmulld(auVar19,auVar183);
  auVar162 = pmulld(auVar25,auVar201);
  local_2b8 = auVar167._0_4_ + iVar115 + auVar154._0_4_ >> auVar217;
  iStack_2b4 = auVar167._4_4_ + iVar115 + auVar154._4_4_ >> auVar217;
  iStack_2b0 = auVar167._8_4_ + iVar115 + auVar154._8_4_ >> auVar217;
  iStack_2ac = auVar167._12_4_ + iVar115 + auVar154._12_4_ >> auVar217;
  auVar167 = pmulld(auVar17,auVar201);
  auVar154 = pmulld(auVar27,auVar192);
  local_2a8 = auVar167._0_4_ + iVar115 + auVar154._0_4_ >> auVar217;
  iStack_2a4 = auVar167._4_4_ + iVar115 + auVar154._4_4_ >> auVar217;
  iStack_2a0 = auVar167._8_4_ + iVar115 + auVar154._8_4_ >> auVar217;
  iStack_29c = auVar167._12_4_ + iVar115 + auVar154._12_4_ >> auVar217;
  auVar167 = pmulld(auVar16,auVar192);
  auVar154 = pmulld(auVar29,auVar219);
  local_298 = auVar167._0_4_ + iVar115 + auVar154._0_4_ >> auVar217;
  iStack_294 = auVar167._4_4_ + iVar115 + auVar154._4_4_ >> auVar217;
  iStack_290 = auVar167._8_4_ + iVar115 + auVar154._8_4_ >> auVar217;
  iStack_28c = auVar167._12_4_ + iVar115 + auVar154._12_4_ >> auVar217;
  auVar154 = pmulld(auVar15,auVar192);
  auVar167 = pmulld(auVar31,auVar219);
  local_288 = auVar154._0_4_ + iVar115 + auVar167._0_4_ >> auVar217;
  iStack_284 = auVar154._4_4_ + iVar115 + auVar167._4_4_ >> auVar217;
  iStack_280 = auVar154._8_4_ + iVar115 + auVar167._8_4_ >> auVar217;
  iStack_27c = auVar154._12_4_ + iVar115 + auVar167._12_4_ >> auVar217;
  local_338 = auVar178._0_4_ + iVar115 + auVar134._0_4_ >> auVar217;
  iStack_334 = auVar178._4_4_ + iVar115 + auVar134._4_4_ >> auVar217;
  iStack_330 = auVar178._8_4_ + iVar115 + auVar134._8_4_ >> auVar217;
  iStack_32c = auVar178._12_4_ + iVar115 + auVar134._12_4_ >> auVar217;
  local_328 = auVar166._0_4_ + iVar115 + auVar185._0_4_ >> auVar217;
  iStack_324 = auVar166._4_4_ + iVar115 + auVar185._4_4_ >> auVar217;
  iStack_320 = auVar166._8_4_ + iVar115 + auVar185._8_4_ >> auVar217;
  iStack_31c = auVar166._12_4_ + iVar115 + auVar185._12_4_ >> auVar217;
  local_318 = auVar180._0_4_ + iVar115 + auVar151._0_4_ >> auVar217;
  iStack_314 = auVar180._4_4_ + iVar115 + auVar151._4_4_ >> auVar217;
  iStack_310 = auVar180._8_4_ + iVar115 + auVar151._8_4_ >> auVar217;
  iStack_30c = auVar180._12_4_ + iVar115 + auVar151._12_4_ >> auVar217;
  local_308 = auVar214._0_4_ + iVar115 + auVar162._0_4_ >> auVar217;
  iStack_304 = auVar214._4_4_ + iVar115 + auVar162._4_4_ >> auVar217;
  iStack_300 = auVar214._8_4_ + iVar115 + auVar162._8_4_ >> auVar217;
  iStack_2fc = auVar214._12_4_ + iVar115 + auVar162._12_4_ >> auVar217;
  uVar110 = 0x20;
  do {
    lVar109 = 0;
    uVar114 = uVar110;
    do {
      piVar1 = (int *)((long)puVar108 + lVar109);
      uVar119 = uVar114 ^ 7;
      iVar113 = local_458[uVar119 * 4] + *piVar1;
      iVar118 = local_458[uVar119 * 4 + 1] + piVar1[1];
      iVar131 = local_458[uVar119 * 4 + 2] + piVar1[2];
      iVar143 = local_458[uVar119 * 4 + 3] + piVar1[3];
      iVar116 = *piVar1 - local_458[uVar119 * 4];
      iVar145 = piVar1[1] - local_458[uVar119 * 4 + 1];
      iVar120 = piVar1[2] - local_458[uVar119 * 4 + 2];
      iVar112 = piVar1[3] - local_458[uVar119 * 4 + 3];
      uVar197 = (uint)(iVar113 < iVar121) * iVar121 | (uint)(iVar113 >= iVar121) * iVar113;
      uVar203 = (uint)(iVar118 < iVar121) * iVar121 | (uint)(iVar118 >= iVar121) * iVar118;
      uVar205 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
      uVar207 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
      uVar132 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
      uVar144 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
      uVar147 = (uint)(iVar120 < iVar121) * iVar121 | (uint)(iVar120 >= iVar121) * iVar120;
      uVar149 = (uint)(iVar112 < iVar121) * iVar121 | (uint)(iVar112 >= iVar121) * iVar112;
      puVar2 = (uint *)((long)puVar108 + lVar109);
      *puVar2 = (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
      puVar2[1] = (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
      puVar2[2] = (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
      puVar2[3] = (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
      local_458[uVar119 * 4] =
           (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
      local_458[uVar119 * 4 + 1] =
           (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
      local_458[uVar119 * 4 + 2] =
           (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
      local_458[uVar119 * 4 + 3] =
           (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
      uVar119 = uVar114 ^ 0xf;
      uVar122 = uVar114 ^ 8;
      iVar113 = local_458[uVar122 * 4] + local_458[uVar119 * 4];
      iVar118 = local_458[uVar122 * 4 + 1] + local_458[uVar119 * 4 + 1];
      iVar131 = local_458[uVar122 * 4 + 2] + local_458[uVar119 * 4 + 2];
      iVar143 = local_458[uVar122 * 4 + 3] + local_458[uVar119 * 4 + 3];
      iVar116 = local_458[uVar119 * 4] - local_458[uVar122 * 4];
      iVar145 = local_458[uVar119 * 4 + 1] - local_458[uVar122 * 4 + 1];
      iVar120 = local_458[uVar119 * 4 + 2] - local_458[uVar122 * 4 + 2];
      iVar112 = local_458[uVar119 * 4 + 3] - local_458[uVar122 * 4 + 3];
      uVar197 = (uint)(iVar113 < iVar121) * iVar121 | (uint)(iVar113 >= iVar121) * iVar113;
      uVar203 = (uint)(iVar118 < iVar121) * iVar121 | (uint)(iVar118 >= iVar121) * iVar118;
      uVar205 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
      uVar207 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
      uVar132 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
      uVar144 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
      uVar147 = (uint)(iVar120 < iVar121) * iVar121 | (uint)(iVar120 >= iVar121) * iVar120;
      uVar149 = (uint)(iVar112 < iVar121) * iVar121 | (uint)(iVar112 >= iVar121) * iVar112;
      local_458[uVar119 * 4] =
           (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
      local_458[uVar119 * 4 + 1] =
           (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
      local_458[uVar119 * 4 + 2] =
           (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
      local_458[uVar119 * 4 + 3] =
           (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
      local_458[uVar122 * 4] =
           (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
      local_458[uVar122 * 4 + 1] =
           (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
      local_458[uVar122 * 4 + 2] =
           (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
      local_458[uVar122 * 4 + 3] =
           (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
      uVar114 = uVar114 + 1;
      lVar109 = lVar109 + 0x10;
    } while (lVar109 != 0x40);
    puVar108 = puVar108 + 0x40;
    uVar132 = (uint)uVar110;
    uVar110 = uVar110 + 0x10;
  } while (uVar132 < 0x30);
  puVar108 = local_3e8;
  lVar109 = 0;
  do {
    iVar116 = *(int *)((long)local_458 + lVar109 + 4);
    iVar145 = *(int *)((long)local_458 + lVar109 + 8);
    iVar120 = *(int *)((long)local_458 + lVar109 + 0xc);
    iVar113 = *puVar108 + *(int *)((long)local_458 + lVar109);
    iVar118 = puVar108[1] + iVar116;
    iVar131 = puVar108[2] + iVar145;
    iVar143 = puVar108[3] + iVar120;
    iVar112 = *(int *)((long)local_458 + lVar109) - *puVar108;
    iVar116 = iVar116 - puVar108[1];
    iVar145 = iVar145 - puVar108[2];
    iVar120 = iVar120 - puVar108[3];
    uVar197 = (uint)(iVar113 < iVar121) * iVar121 | (uint)(iVar113 >= iVar121) * iVar113;
    uVar203 = (uint)(iVar118 < iVar121) * iVar121 | (uint)(iVar118 >= iVar121) * iVar118;
    uVar205 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
    uVar207 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
    uVar132 = (uint)(iVar112 < iVar121) * iVar121 | (uint)(iVar112 >= iVar121) * iVar112;
    uVar144 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
    uVar147 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
    uVar149 = (uint)(iVar120 < iVar121) * iVar121 | (uint)(iVar120 >= iVar121) * iVar120;
    *(uint *)((long)local_458 + lVar109) =
         (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
    *(uint *)((long)local_458 + lVar109 + 4) =
         (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
    *(uint *)((long)local_458 + lVar109 + 8) =
         (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
    *(uint *)((long)local_458 + lVar109 + 0xc) =
         (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
    *puVar108 = (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
    puVar108[1] = (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
    puVar108[2] = (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
    puVar108[3] = (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
    puVar108 = puVar108 + -4;
    lVar109 = lVar109 + 0x10;
  } while (lVar109 != 0x40);
  puVar108 = local_368;
  auVar9._4_4_ = uStack_3b4;
  auVar9._0_4_ = local_3b8;
  auVar9._8_4_ = uStack_3b0;
  auVar9._12_4_ = uStack_3ac;
  auVar10._4_4_ = uStack_3a4;
  auVar10._0_4_ = local_3a8;
  auVar10._8_4_ = uStack_3a0;
  auVar10._12_4_ = uStack_39c;
  auVar11._4_4_ = uStack_394;
  auVar11._0_4_ = local_398;
  auVar11._8_4_ = uStack_390;
  auVar11._12_4_ = uStack_38c;
  auVar13._4_4_ = uStack_384;
  auVar13._0_4_ = local_388;
  auVar13._8_4_ = uStack_380;
  auVar13._12_4_ = uStack_37c;
  auVar127._0_4_ = local_388 + local_3b8;
  auVar127._4_4_ = uStack_384 + uStack_3b4;
  auVar127._8_4_ = uStack_380 + uStack_3b0;
  auVar127._12_4_ = uStack_37c + uStack_3ac;
  auVar162 = pmulld(auVar9,auVar188);
  auVar185 = pmulld(auVar13,auVar126);
  auVar134 = pmulld(auVar127,auVar126);
  local_388 = auVar134._0_4_ + iVar115 >> auVar217;
  uStack_384 = auVar134._4_4_ + iVar115 >> auVar217;
  uStack_380 = auVar134._8_4_ + iVar115 >> auVar217;
  uStack_37c = auVar134._12_4_ + iVar115 >> auVar217;
  auVar163._0_4_ = local_398 + local_3a8;
  auVar163._4_4_ = uStack_394 + uStack_3a4;
  auVar163._8_4_ = uStack_390 + uStack_3a0;
  auVar163._12_4_ = uStack_38c + uStack_39c;
  auVar154 = pmulld(auVar10,auVar188);
  auVar134 = pmulld(auVar11,auVar126);
  auVar151 = pmulld(auVar163,auVar126);
  local_3b8 = auVar162._0_4_ + iVar115 + auVar185._0_4_ >> auVar217;
  uStack_3b4 = auVar162._4_4_ + iVar115 + auVar185._4_4_ >> auVar217;
  uStack_3b0 = auVar162._8_4_ + iVar115 + auVar185._8_4_ >> auVar217;
  uStack_3ac = auVar162._12_4_ + iVar115 + auVar185._12_4_ >> auVar217;
  local_398 = auVar151._0_4_ + iVar115 >> auVar217;
  uStack_394 = auVar151._4_4_ + iVar115 >> auVar217;
  uStack_390 = auVar151._8_4_ + iVar115 >> auVar217;
  uStack_38c = auVar151._12_4_ + iVar115 >> auVar217;
  local_3a8 = auVar154._0_4_ + iVar115 + auVar134._0_4_ >> auVar217;
  uStack_3a4 = auVar154._4_4_ + iVar115 + auVar134._4_4_ >> auVar217;
  uStack_3a0 = auVar154._8_4_ + iVar115 + auVar134._8_4_ >> auVar217;
  uStack_39c = auVar154._12_4_ + iVar115 + auVar134._12_4_ >> auVar217;
  uVar110 = 0x10;
  do {
    puVar108 = puVar108 + 4;
    uVar114 = uVar110 ^ 7;
    iVar113 = local_458[uVar114 * 4] + *puVar108;
    iVar118 = local_458[uVar114 * 4 + 1] + puVar108[1];
    iVar131 = local_458[uVar114 * 4 + 2] + puVar108[2];
    iVar143 = local_458[uVar114 * 4 + 3] + puVar108[3];
    iVar116 = *puVar108 - local_458[uVar114 * 4];
    iVar145 = puVar108[1] - local_458[uVar114 * 4 + 1];
    iVar120 = puVar108[2] - local_458[uVar114 * 4 + 2];
    iVar112 = puVar108[3] - local_458[uVar114 * 4 + 3];
    uVar197 = (uint)(iVar113 < iVar121) * iVar121 | (uint)(iVar113 >= iVar121) * iVar113;
    uVar203 = (uint)(iVar118 < iVar121) * iVar121 | (uint)(iVar118 >= iVar121) * iVar118;
    uVar205 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
    uVar207 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
    uVar132 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
    uVar144 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
    uVar147 = (uint)(iVar120 < iVar121) * iVar121 | (uint)(iVar120 >= iVar121) * iVar120;
    uVar149 = (uint)(iVar112 < iVar121) * iVar121 | (uint)(iVar112 >= iVar121) * iVar112;
    *puVar108 = (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
    puVar108[1] = (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
    puVar108[2] = (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
    puVar108[3] = (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
    local_458[uVar114 * 4] =
         (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
    local_458[uVar114 * 4 + 1] =
         (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
    local_458[uVar114 * 4 + 2] =
         (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
    local_458[uVar114 * 4 + 3] =
         (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
    uVar114 = uVar110 ^ 0xf;
    uVar119 = uVar110 ^ 8;
    iVar113 = local_458[uVar119 * 4] + local_458[uVar114 * 4];
    iVar118 = local_458[uVar119 * 4 + 1] + local_458[uVar114 * 4 + 1];
    iVar131 = local_458[uVar119 * 4 + 2] + local_458[uVar114 * 4 + 2];
    iVar143 = local_458[uVar119 * 4 + 3] + local_458[uVar114 * 4 + 3];
    iVar116 = local_458[uVar114 * 4] - local_458[uVar119 * 4];
    iVar145 = local_458[uVar114 * 4 + 1] - local_458[uVar119 * 4 + 1];
    iVar120 = local_458[uVar114 * 4 + 2] - local_458[uVar119 * 4 + 2];
    iVar112 = local_458[uVar114 * 4 + 3] - local_458[uVar119 * 4 + 3];
    uVar197 = (uint)(iVar113 < iVar121) * iVar121 | (uint)(iVar113 >= iVar121) * iVar113;
    uVar203 = (uint)(iVar118 < iVar121) * iVar121 | (uint)(iVar118 >= iVar121) * iVar118;
    uVar205 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
    uVar207 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
    uVar132 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
    uVar144 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
    uVar147 = (uint)(iVar120 < iVar121) * iVar121 | (uint)(iVar120 >= iVar121) * iVar120;
    uVar149 = (uint)(iVar112 < iVar121) * iVar121 | (uint)(iVar112 >= iVar121) * iVar112;
    local_458[uVar114 * 4] =
         (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
    local_458[uVar114 * 4 + 1] =
         (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
    local_458[uVar114 * 4 + 2] =
         (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
    local_458[uVar114 * 4 + 3] =
         (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
    local_458[uVar119 * 4] =
         (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
    local_458[uVar119 * 4 + 1] =
         (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
    local_458[uVar119 * 4 + 2] =
         (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
    local_458[uVar119 * 4 + 3] =
         (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
    uVar110 = uVar110 + 1;
  } while (uVar110 != 0x14);
  puVar108 = local_368;
  auVar38._4_4_ = iStack_214;
  auVar38._0_4_ = local_218;
  auVar38._8_4_ = iStack_210;
  auVar38._12_4_ = iStack_20c;
  auVar41._4_4_ = iStack_204;
  auVar41._0_4_ = local_208;
  auVar41._8_4_ = iStack_200;
  auVar41._12_4_ = iStack_1fc;
  auVar43._4_4_ = iStack_1f4;
  auVar43._0_4_ = local_1f8;
  auVar43._8_4_ = iStack_1f0;
  auVar43._12_4_ = iStack_1ec;
  auVar44._4_4_ = iStack_1e4;
  auVar44._0_4_ = local_1e8;
  auVar44._8_4_ = iStack_1e0;
  auVar44._12_4_ = iStack_1dc;
  auVar178 = pmulld(auVar38,auVar201);
  auVar95._4_4_ = iStack_a4;
  auVar95._0_4_ = local_a8;
  auVar95._8_4_ = iStack_a0;
  auVar95._12_4_ = iStack_9c;
  auVar134 = pmulld(auVar95,auVar192);
  auVar180 = pmulld(auVar41,auVar201);
  auVar93._4_4_ = iStack_b4;
  auVar93._0_4_ = local_b8;
  auVar93._8_4_ = iStack_b0;
  auVar93._12_4_ = iStack_ac;
  auVar185 = pmulld(auVar93,auVar192);
  auVar214 = pmulld(auVar43,auVar201);
  auVar91._4_4_ = iStack_c4;
  auVar91._0_4_ = local_c8;
  auVar91._8_4_ = iStack_c0;
  auVar91._12_4_ = iStack_bc;
  auVar151 = pmulld(auVar91,auVar192);
  auVar167 = pmulld(auVar44,auVar201);
  auVar90._4_4_ = iStack_d4;
  auVar90._0_4_ = local_d8;
  auVar90._8_4_ = iStack_d0;
  auVar90._12_4_ = iStack_cc;
  auVar162 = pmulld(auVar90,auVar192);
  auVar222 = pmulld(auVar44,auVar192);
  auVar154 = pmulld(auVar90,auVar219);
  auVar215 = pmulld(auVar43,auVar192);
  auVar166 = pmulld(auVar91,auVar219);
  local_d8 = auVar222._0_4_ + iVar115 + auVar154._0_4_ >> auVar217;
  iStack_d4 = auVar222._4_4_ + iVar115 + auVar154._4_4_ >> auVar217;
  iStack_d0 = auVar222._8_4_ + iVar115 + auVar154._8_4_ >> auVar217;
  iStack_cc = auVar222._12_4_ + iVar115 + auVar154._12_4_ >> auVar217;
  local_c8 = auVar215._0_4_ + iVar115 + auVar166._0_4_ >> auVar217;
  iStack_c4 = auVar215._4_4_ + iVar115 + auVar166._4_4_ >> auVar217;
  iStack_c0 = auVar215._8_4_ + iVar115 + auVar166._8_4_ >> auVar217;
  iStack_bc = auVar215._12_4_ + iVar115 + auVar166._12_4_ >> auVar217;
  auVar154 = pmulld(auVar41,auVar192);
  auVar166 = pmulld(auVar93,auVar219);
  local_b8 = auVar154._0_4_ + iVar115 + auVar166._0_4_ >> auVar217;
  iStack_b4 = auVar154._4_4_ + iVar115 + auVar166._4_4_ >> auVar217;
  iStack_b0 = auVar154._8_4_ + iVar115 + auVar166._8_4_ >> auVar217;
  iStack_ac = auVar154._12_4_ + iVar115 + auVar166._12_4_ >> auVar217;
  auVar166 = pmulld(auVar38,auVar192);
  auVar154 = pmulld(auVar95,auVar219);
  local_a8 = auVar166._0_4_ + iVar115 + auVar154._0_4_ >> auVar217;
  iStack_a4 = auVar166._4_4_ + iVar115 + auVar154._4_4_ >> auVar217;
  iStack_a0 = auVar166._8_4_ + iVar115 + auVar154._8_4_ >> auVar217;
  iStack_9c = auVar166._12_4_ + iVar115 + auVar154._12_4_ >> auVar217;
  local_218 = auVar178._0_4_ + iVar115 + auVar134._0_4_ >> auVar217;
  iStack_214 = auVar178._4_4_ + iVar115 + auVar134._4_4_ >> auVar217;
  iStack_210 = auVar178._8_4_ + iVar115 + auVar134._8_4_ >> auVar217;
  iStack_20c = auVar178._12_4_ + iVar115 + auVar134._12_4_ >> auVar217;
  local_208 = auVar180._0_4_ + iVar115 + auVar185._0_4_ >> auVar217;
  iStack_204 = auVar180._4_4_ + iVar115 + auVar185._4_4_ >> auVar217;
  iStack_200 = auVar180._8_4_ + iVar115 + auVar185._8_4_ >> auVar217;
  iStack_1fc = auVar180._12_4_ + iVar115 + auVar185._12_4_ >> auVar217;
  local_1f8 = auVar214._0_4_ + iVar115 + auVar151._0_4_ >> auVar217;
  iStack_1f4 = auVar214._4_4_ + iVar115 + auVar151._4_4_ >> auVar217;
  iStack_1f0 = auVar214._8_4_ + iVar115 + auVar151._8_4_ >> auVar217;
  iStack_1ec = auVar214._12_4_ + iVar115 + auVar151._12_4_ >> auVar217;
  local_1e8 = auVar167._0_4_ + iVar115 + auVar162._0_4_ >> auVar217;
  iStack_1e4 = auVar167._4_4_ + iVar115 + auVar162._4_4_ >> auVar217;
  iStack_1e0 = auVar167._8_4_ + iVar115 + auVar162._8_4_ >> auVar217;
  iStack_1dc = auVar167._12_4_ + iVar115 + auVar162._12_4_ >> auVar217;
  auVar46._4_4_ = iStack_1d4;
  auVar46._0_4_ = local_1d8;
  auVar46._8_4_ = iStack_1d0;
  auVar46._12_4_ = iStack_1cc;
  auVar178 = pmulld(auVar46,auVar183);
  auVar87._4_4_ = iStack_e4;
  auVar87._0_4_ = local_e8;
  auVar87._8_4_ = iStack_e0;
  auVar87._12_4_ = iStack_dc;
  auVar134 = pmulld(auVar87,auVar201);
  auVar49._4_4_ = iStack_1c4;
  auVar49._0_4_ = local_1c8;
  auVar49._8_4_ = iStack_1c0;
  auVar49._12_4_ = iStack_1bc;
  auVar167 = pmulld(auVar49,auVar183);
  auVar85._4_4_ = iStack_f4;
  auVar85._0_4_ = local_f8;
  auVar85._8_4_ = iStack_f0;
  auVar85._12_4_ = iStack_ec;
  auVar185 = pmulld(auVar85,auVar201);
  auVar53._4_4_ = iStack_1b4;
  auVar53._0_4_ = local_1b8;
  auVar53._8_4_ = iStack_1b0;
  auVar53._12_4_ = iStack_1ac;
  auVar180 = pmulld(auVar53,auVar183);
  auVar82._4_4_ = iStack_104;
  auVar82._0_4_ = local_108;
  auVar82._8_4_ = iStack_100;
  auVar82._12_4_ = iStack_fc;
  auVar151 = pmulld(auVar82,auVar201);
  auVar56._4_4_ = iStack_1a4;
  auVar56._0_4_ = local_1a8;
  auVar56._8_4_ = iStack_1a0;
  auVar56._12_4_ = iStack_19c;
  auVar166 = pmulld(auVar183,auVar56);
  auVar78._4_4_ = iStack_114;
  auVar78._0_4_ = local_118;
  auVar78._8_4_ = iStack_110;
  auVar78._12_4_ = iStack_10c;
  auVar154 = pmulld(auVar56,auVar201);
  auVar162 = pmulld(auVar78,auVar192);
  auVar214 = pmulld(auVar78,auVar201);
  local_118 = auVar154._0_4_ + iVar115 + auVar162._0_4_ >> auVar217;
  iStack_114 = auVar154._4_4_ + iVar115 + auVar162._4_4_ >> auVar217;
  iStack_110 = auVar154._8_4_ + iVar115 + auVar162._8_4_ >> auVar217;
  iStack_10c = auVar154._12_4_ + iVar115 + auVar162._12_4_ >> auVar217;
  auVar154 = pmulld(auVar53,auVar201);
  auVar162 = pmulld(auVar82,auVar192);
  local_108 = auVar154._0_4_ + iVar115 + auVar162._0_4_ >> auVar217;
  iStack_104 = auVar154._4_4_ + iVar115 + auVar162._4_4_ >> auVar217;
  iStack_100 = auVar154._8_4_ + iVar115 + auVar162._8_4_ >> auVar217;
  iStack_fc = auVar154._12_4_ + iVar115 + auVar162._12_4_ >> auVar217;
  auVar162 = pmulld(auVar49,auVar201);
  auVar154 = pmulld(auVar85,auVar192);
  local_f8 = auVar162._0_4_ + iVar115 + auVar154._0_4_ >> auVar217;
  iStack_f4 = auVar162._4_4_ + iVar115 + auVar154._4_4_ >> auVar217;
  iStack_f0 = auVar162._8_4_ + iVar115 + auVar154._8_4_ >> auVar217;
  iStack_ec = auVar162._12_4_ + iVar115 + auVar154._12_4_ >> auVar217;
  auVar162 = pmulld(auVar46,auVar201);
  auVar154 = pmulld(auVar87,auVar192);
  local_e8 = auVar162._0_4_ + iVar115 + auVar154._0_4_ >> auVar217;
  iStack_e4 = auVar162._4_4_ + iVar115 + auVar154._4_4_ >> auVar217;
  iStack_e0 = auVar162._8_4_ + iVar115 + auVar154._8_4_ >> auVar217;
  iStack_dc = auVar162._12_4_ + iVar115 + auVar154._12_4_ >> auVar217;
  local_1d8 = auVar178._0_4_ + iVar115 + auVar134._0_4_ >> auVar217;
  iStack_1d4 = auVar178._4_4_ + iVar115 + auVar134._4_4_ >> auVar217;
  iStack_1d0 = auVar178._8_4_ + iVar115 + auVar134._8_4_ >> auVar217;
  iStack_1cc = auVar178._12_4_ + iVar115 + auVar134._12_4_ >> auVar217;
  local_1c8 = auVar167._0_4_ + iVar115 + auVar185._0_4_ >> auVar217;
  iStack_1c4 = auVar167._4_4_ + iVar115 + auVar185._4_4_ >> auVar217;
  iStack_1c0 = auVar167._8_4_ + iVar115 + auVar185._8_4_ >> auVar217;
  iStack_1bc = auVar167._12_4_ + iVar115 + auVar185._12_4_ >> auVar217;
  local_1b8 = auVar180._0_4_ + iVar115 + auVar151._0_4_ >> auVar217;
  iStack_1b4 = auVar180._4_4_ + iVar115 + auVar151._4_4_ >> auVar217;
  iStack_1b0 = auVar180._8_4_ + iVar115 + auVar151._8_4_ >> auVar217;
  iStack_1ac = auVar180._12_4_ + iVar115 + auVar151._12_4_ >> auVar217;
  local_1a8 = auVar166._0_4_ + iVar115 + auVar214._0_4_ >> auVar217;
  iStack_1a4 = auVar166._4_4_ + iVar115 + auVar214._4_4_ >> auVar217;
  iStack_1a0 = auVar166._8_4_ + iVar115 + auVar214._8_4_ >> auVar217;
  iStack_19c = auVar166._12_4_ + iVar115 + auVar214._12_4_ >> auVar217;
  lVar109 = 0;
  do {
    iVar116 = *(int *)((long)local_458 + lVar109 + 4);
    iVar145 = *(int *)((long)local_458 + lVar109 + 8);
    iVar120 = *(int *)((long)local_458 + lVar109 + 0xc);
    iVar113 = *puVar108 + *(int *)((long)local_458 + lVar109);
    iVar118 = puVar108[1] + iVar116;
    iVar131 = puVar108[2] + iVar145;
    iVar143 = puVar108[3] + iVar120;
    iVar112 = *(int *)((long)local_458 + lVar109) - *puVar108;
    iVar116 = iVar116 - puVar108[1];
    iVar145 = iVar145 - puVar108[2];
    iVar120 = iVar120 - puVar108[3];
    uVar197 = (uint)(iVar113 < iVar121) * iVar121 | (uint)(iVar113 >= iVar121) * iVar113;
    uVar203 = (uint)(iVar118 < iVar121) * iVar121 | (uint)(iVar118 >= iVar121) * iVar118;
    uVar205 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
    uVar207 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
    uVar132 = (uint)(iVar112 < iVar121) * iVar121 | (uint)(iVar112 >= iVar121) * iVar112;
    uVar144 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
    uVar147 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
    uVar149 = (uint)(iVar120 < iVar121) * iVar121 | (uint)(iVar120 >= iVar121) * iVar120;
    *(uint *)((long)local_458 + lVar109) =
         (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
    *(uint *)((long)local_458 + lVar109 + 4) =
         (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
    *(uint *)((long)local_458 + lVar109 + 8) =
         (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
    *(uint *)((long)local_458 + lVar109 + 0xc) =
         (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
    *puVar108 = (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
    puVar108[1] = (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
    puVar108[2] = (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
    puVar108[3] = (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
    lVar109 = lVar109 + 0x10;
    puVar108 = puVar108 + -4;
  } while (lVar109 != 0x80);
  puVar108 = local_268;
  auVar18._4_4_ = iStack_314;
  auVar18._0_4_ = local_318;
  auVar18._8_4_ = iStack_310;
  auVar18._12_4_ = iStack_30c;
  auVar20._4_4_ = iStack_304;
  auVar20._0_4_ = local_308;
  auVar20._8_4_ = iStack_300;
  auVar20._12_4_ = iStack_2fc;
  auVar21._4_4_ = iStack_2f4;
  auVar21._0_4_ = local_2f8;
  auVar21._8_4_ = iStack_2f0;
  auVar21._12_4_ = iStack_2ec;
  auVar22._4_4_ = iStack_2e4;
  auVar22._0_4_ = local_2e8;
  auVar22._8_4_ = iStack_2e0;
  auVar22._12_4_ = iStack_2dc;
  auVar28._4_4_ = iStack_2a4;
  auVar28._0_4_ = local_2a8;
  auVar28._8_4_ = iStack_2a0;
  auVar28._12_4_ = iStack_29c;
  auVar128._0_4_ = local_2a8 + local_318;
  auVar128._4_4_ = iStack_2a4 + iStack_314;
  auVar128._8_4_ = iStack_2a0 + iStack_310;
  auVar128._12_4_ = iStack_29c + iStack_30c;
  auVar167 = pmulld(auVar18,auVar188);
  auVar178 = pmulld(auVar28,auVar126);
  auVar26._4_4_ = iStack_2b4;
  auVar26._0_4_ = local_2b8;
  auVar26._8_4_ = iStack_2b0;
  auVar26._12_4_ = iStack_2ac;
  auVar173._0_4_ = local_2b8 + local_308;
  auVar173._4_4_ = iStack_2b4 + iStack_304;
  auVar173._8_4_ = iStack_2b0 + iStack_300;
  auVar173._12_4_ = iStack_2ac + iStack_2fc;
  auVar151 = pmulld(auVar20,auVar188);
  auVar185 = pmulld(auVar26,auVar126);
  auVar24._4_4_ = iStack_2c4;
  auVar24._0_4_ = local_2c8;
  auVar24._8_4_ = iStack_2c0;
  auVar24._12_4_ = iStack_2bc;
  auVar140._0_4_ = local_2c8 + local_2f8;
  auVar140._4_4_ = iStack_2c4 + iStack_2f4;
  auVar140._8_4_ = iStack_2c0 + iStack_2f0;
  auVar140._12_4_ = iStack_2bc + iStack_2ec;
  auVar166 = pmulld(auVar21,auVar188);
  auVar180 = pmulld(auVar24,auVar126);
  auVar23._4_4_ = iStack_2d4;
  auVar23._0_4_ = local_2d8;
  auVar23._8_4_ = iStack_2d0;
  auVar23._12_4_ = iStack_2cc;
  auVar193._0_4_ = local_2d8 + local_2e8;
  auVar193._4_4_ = iStack_2d4 + iStack_2e4;
  auVar193._8_4_ = iStack_2d0 + iStack_2e0;
  auVar193._12_4_ = iStack_2cc + iStack_2dc;
  auVar154 = pmulld(auVar22,auVar188);
  auVar214 = pmulld(auVar23,auVar126);
  auVar134 = pmulld(auVar193,auVar126);
  local_2d8 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_2d4 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_2d0 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_2cc = auVar134._12_4_ + iVar115 >> auVar217;
  auVar134 = pmulld(auVar140,auVar126);
  auVar162 = pmulld(auVar173,auVar126);
  local_2c8 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_2c4 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_2c0 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_2bc = auVar134._12_4_ + iVar115 >> auVar217;
  local_2b8 = auVar162._0_4_ + iVar115 >> auVar217;
  iStack_2b4 = auVar162._4_4_ + iVar115 >> auVar217;
  iStack_2b0 = auVar162._8_4_ + iVar115 >> auVar217;
  iStack_2ac = auVar162._12_4_ + iVar115 >> auVar217;
  auVar134 = pmulld(auVar128,auVar126);
  local_2a8 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_2a4 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_2a0 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_29c = auVar134._12_4_ + iVar115 >> auVar217;
  local_318 = auVar167._0_4_ + iVar115 + auVar178._0_4_ >> auVar217;
  iStack_314 = auVar167._4_4_ + iVar115 + auVar178._4_4_ >> auVar217;
  iStack_310 = auVar167._8_4_ + iVar115 + auVar178._8_4_ >> auVar217;
  iStack_30c = auVar167._12_4_ + iVar115 + auVar178._12_4_ >> auVar217;
  local_308 = auVar151._0_4_ + iVar115 + auVar185._0_4_ >> auVar217;
  iStack_304 = auVar151._4_4_ + iVar115 + auVar185._4_4_ >> auVar217;
  iStack_300 = auVar151._8_4_ + iVar115 + auVar185._8_4_ >> auVar217;
  iStack_2fc = auVar151._12_4_ + iVar115 + auVar185._12_4_ >> auVar217;
  local_2f8 = auVar166._0_4_ + iVar115 + auVar180._0_4_ >> auVar217;
  iStack_2f4 = auVar166._4_4_ + iVar115 + auVar180._4_4_ >> auVar217;
  iStack_2f0 = auVar166._8_4_ + iVar115 + auVar180._8_4_ >> auVar217;
  iStack_2ec = auVar166._12_4_ + iVar115 + auVar180._12_4_ >> auVar217;
  local_2e8 = auVar154._0_4_ + iVar115 + auVar214._0_4_ >> auVar217;
  iStack_2e4 = auVar154._4_4_ + iVar115 + auVar214._4_4_ >> auVar217;
  iStack_2e0 = auVar154._8_4_ + iVar115 + auVar214._8_4_ >> auVar217;
  iStack_2dc = auVar154._12_4_ + iVar115 + auVar214._12_4_ >> auVar217;
  uVar110 = 0x20;
  do {
    puVar108 = puVar108 + 4;
    uVar114 = uVar110 ^ 0xf;
    iVar113 = local_458[uVar114 * 4] + *puVar108;
    iVar118 = local_458[uVar114 * 4 + 1] + puVar108[1];
    iVar131 = local_458[uVar114 * 4 + 2] + puVar108[2];
    iVar143 = local_458[uVar114 * 4 + 3] + puVar108[3];
    iVar116 = *puVar108 - local_458[uVar114 * 4];
    iVar145 = puVar108[1] - local_458[uVar114 * 4 + 1];
    iVar120 = puVar108[2] - local_458[uVar114 * 4 + 2];
    iVar112 = puVar108[3] - local_458[uVar114 * 4 + 3];
    uVar197 = (uint)(iVar113 < iVar121) * iVar121 | (uint)(iVar113 >= iVar121) * iVar113;
    uVar203 = (uint)(iVar118 < iVar121) * iVar121 | (uint)(iVar118 >= iVar121) * iVar118;
    uVar205 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
    uVar207 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
    uVar132 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
    uVar144 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
    uVar147 = (uint)(iVar120 < iVar121) * iVar121 | (uint)(iVar120 >= iVar121) * iVar120;
    uVar149 = (uint)(iVar112 < iVar121) * iVar121 | (uint)(iVar112 >= iVar121) * iVar112;
    *puVar108 = (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
    puVar108[1] = (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
    puVar108[2] = (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
    puVar108[3] = (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
    local_458[uVar114 * 4] =
         (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
    local_458[uVar114 * 4 + 1] =
         (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
    local_458[uVar114 * 4 + 2] =
         (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
    local_458[uVar114 * 4 + 3] =
         (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
    uVar110 = uVar110 + 1;
  } while (uVar110 != 0x28);
  uVar110 = 0x30;
  puVar108 = local_158;
  do {
    uVar114 = uVar110 ^ 0xf;
    iVar113 = *puVar108 + local_458[uVar114 * 4];
    iVar118 = puVar108[1] + local_458[uVar114 * 4 + 1];
    iVar131 = puVar108[2] + local_458[uVar114 * 4 + 2];
    iVar143 = puVar108[3] + local_458[uVar114 * 4 + 3];
    iVar116 = local_458[uVar114 * 4] - *puVar108;
    iVar145 = local_458[uVar114 * 4 + 1] - puVar108[1];
    iVar120 = local_458[uVar114 * 4 + 2] - puVar108[2];
    iVar112 = local_458[uVar114 * 4 + 3] - puVar108[3];
    uVar197 = (uint)(iVar113 < iVar121) * iVar121 | (uint)(iVar113 >= iVar121) * iVar113;
    uVar203 = (uint)(iVar118 < iVar121) * iVar121 | (uint)(iVar118 >= iVar121) * iVar118;
    uVar205 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
    uVar207 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
    uVar132 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
    uVar144 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
    uVar147 = (uint)(iVar120 < iVar121) * iVar121 | (uint)(iVar120 >= iVar121) * iVar120;
    uVar149 = (uint)(iVar112 < iVar121) * iVar121 | (uint)(iVar112 >= iVar121) * iVar112;
    local_458[uVar114 * 4] =
         (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
    local_458[uVar114 * 4 + 1] =
         (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
    local_458[uVar114 * 4 + 2] =
         (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
    local_458[uVar114 * 4 + 3] =
         (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
    *puVar108 = (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
    puVar108[1] = (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
    puVar108[2] = (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
    puVar108[3] = (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
    uVar110 = uVar110 + 1;
    puVar108 = puVar108 + 4;
  } while (uVar110 != 0x38);
  puVar108 = local_268;
  lVar109 = 0;
  do {
    iVar116 = *(int *)((long)local_458 + lVar109 + 4);
    iVar145 = *(int *)((long)local_458 + lVar109 + 8);
    iVar120 = *(int *)((long)local_458 + lVar109 + 0xc);
    iVar113 = *puVar108 + *(int *)((long)local_458 + lVar109);
    iVar118 = puVar108[1] + iVar116;
    iVar131 = puVar108[2] + iVar145;
    iVar143 = puVar108[3] + iVar120;
    iVar112 = *(int *)((long)local_458 + lVar109) - *puVar108;
    iVar116 = iVar116 - puVar108[1];
    iVar145 = iVar145 - puVar108[2];
    iVar120 = iVar120 - puVar108[3];
    uVar197 = (uint)(iVar113 < iVar121) * iVar121 | (uint)(iVar113 >= iVar121) * iVar113;
    uVar203 = (uint)(iVar118 < iVar121) * iVar121 | (uint)(iVar118 >= iVar121) * iVar118;
    uVar205 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
    uVar207 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
    uVar132 = (uint)(iVar112 < iVar121) * iVar121 | (uint)(iVar112 >= iVar121) * iVar112;
    uVar144 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
    uVar147 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
    uVar149 = (uint)(iVar120 < iVar121) * iVar121 | (uint)(iVar120 >= iVar121) * iVar120;
    *(uint *)((long)local_458 + lVar109) =
         (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
    *(uint *)((long)local_458 + lVar109 + 4) =
         (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
    *(uint *)((long)local_458 + lVar109 + 8) =
         (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
    *(uint *)((long)local_458 + lVar109 + 0xc) =
         (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
    *puVar108 = (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
    puVar108[1] = (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
    puVar108[2] = (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
    puVar108[3] = (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
    lVar109 = lVar109 + 0x10;
    puVar108 = puVar108 + -4;
  } while (lVar109 != 0x100);
  auVar47._4_4_ = iStack_1d4;
  auVar47._0_4_ = local_1d8;
  auVar47._8_4_ = iStack_1d0;
  auVar47._12_4_ = iStack_1cc;
  auVar50._4_4_ = iStack_1c4;
  auVar50._0_4_ = local_1c8;
  auVar50._8_4_ = iStack_1c0;
  auVar50._12_4_ = iStack_1bc;
  auVar54._4_4_ = iStack_1b4;
  auVar54._0_4_ = local_1b8;
  auVar54._8_4_ = iStack_1b0;
  auVar54._12_4_ = iStack_1ac;
  auVar88._4_4_ = iStack_e4;
  auVar88._0_4_ = local_e8;
  auVar88._8_4_ = iStack_e0;
  auVar88._12_4_ = iStack_dc;
  auVar129._0_4_ = local_e8 + local_1d8;
  auVar129._4_4_ = iStack_e4 + iStack_1d4;
  auVar129._8_4_ = iStack_e0 + iStack_1d0;
  auVar129._12_4_ = iStack_dc + iStack_1cc;
  auVar166 = pmulld(auVar47,auVar188);
  auVar167 = pmulld(auVar88,auVar126);
  auVar86._4_4_ = iStack_f4;
  auVar86._0_4_ = local_f8;
  auVar86._8_4_ = iStack_f0;
  auVar86._12_4_ = iStack_ec;
  auVar174._0_4_ = local_f8 + local_1c8;
  auVar174._4_4_ = iStack_f4 + iStack_1c4;
  auVar174._8_4_ = iStack_f0 + iStack_1c0;
  auVar174._12_4_ = iStack_ec + iStack_1bc;
  auVar151 = pmulld(auVar50,auVar188);
  auVar185 = pmulld(auVar86,auVar126);
  auVar83._4_4_ = iStack_104;
  auVar83._0_4_ = local_108;
  auVar83._8_4_ = iStack_100;
  auVar83._12_4_ = iStack_fc;
  auVar141._0_4_ = local_108 + local_1b8;
  auVar141._4_4_ = iStack_104 + iStack_1b4;
  auVar141._8_4_ = iStack_100 + iStack_1b0;
  auVar141._12_4_ = iStack_fc + iStack_1ac;
  auVar154 = pmulld(auVar54,auVar188);
  auVar178 = pmulld(auVar83,auVar126);
  auVar57._4_4_ = iStack_1a4;
  auVar57._0_4_ = local_1a8;
  auVar57._8_4_ = iStack_1a0;
  auVar57._12_4_ = iStack_19c;
  auVar79._4_4_ = iStack_114;
  auVar79._0_4_ = local_118;
  auVar79._8_4_ = iStack_110;
  auVar79._12_4_ = iStack_10c;
  auVar194._0_4_ = local_118 + local_1a8;
  auVar194._4_4_ = iStack_114 + iStack_1a4;
  auVar194._8_4_ = iStack_110 + iStack_1a0;
  auVar194._12_4_ = iStack_10c + iStack_19c;
  auVar180 = pmulld(auVar57,auVar188);
  auVar214 = pmulld(auVar79,auVar126);
  auVar134 = pmulld(auVar194,auVar126);
  local_118 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_114 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_110 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_10c = auVar134._12_4_ + iVar115 >> auVar217;
  auVar134 = pmulld(auVar141,auVar126);
  auVar162 = pmulld(auVar174,auVar126);
  local_108 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_104 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_100 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_fc = auVar134._12_4_ + iVar115 >> auVar217;
  local_f8 = auVar162._0_4_ + iVar115 >> auVar217;
  iStack_f4 = auVar162._4_4_ + iVar115 >> auVar217;
  iStack_f0 = auVar162._8_4_ + iVar115 >> auVar217;
  iStack_ec = auVar162._12_4_ + iVar115 >> auVar217;
  auVar134 = pmulld(auVar129,auVar126);
  local_e8 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_e4 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_e0 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_dc = auVar134._12_4_ + iVar115 >> auVar217;
  local_1d8 = auVar166._0_4_ + iVar115 + auVar167._0_4_ >> auVar217;
  iStack_1d4 = auVar166._4_4_ + iVar115 + auVar167._4_4_ >> auVar217;
  iStack_1d0 = auVar166._8_4_ + iVar115 + auVar167._8_4_ >> auVar217;
  iStack_1cc = auVar166._12_4_ + iVar115 + auVar167._12_4_ >> auVar217;
  local_1c8 = auVar151._0_4_ + iVar115 + auVar185._0_4_ >> auVar217;
  iStack_1c4 = auVar151._4_4_ + iVar115 + auVar185._4_4_ >> auVar217;
  iStack_1c0 = auVar151._8_4_ + iVar115 + auVar185._8_4_ >> auVar217;
  iStack_1bc = auVar151._12_4_ + iVar115 + auVar185._12_4_ >> auVar217;
  local_1b8 = auVar154._0_4_ + iVar115 + auVar178._0_4_ >> auVar217;
  iStack_1b4 = auVar154._4_4_ + iVar115 + auVar178._4_4_ >> auVar217;
  iStack_1b0 = auVar154._8_4_ + iVar115 + auVar178._8_4_ >> auVar217;
  iStack_1ac = auVar154._12_4_ + iVar115 + auVar178._12_4_ >> auVar217;
  local_1a8 = auVar180._0_4_ + iVar115 + auVar214._0_4_ >> auVar217;
  iStack_1a4 = auVar180._4_4_ + iVar115 + auVar214._4_4_ >> auVar217;
  iStack_1a0 = auVar180._8_4_ + iVar115 + auVar214._8_4_ >> auVar217;
  iStack_19c = auVar180._12_4_ + iVar115 + auVar214._12_4_ >> auVar217;
  auVar60._4_4_ = iStack_194;
  auVar60._0_4_ = local_198;
  auVar60._8_4_ = iStack_190;
  auVar60._12_4_ = iStack_18c;
  auVar75._4_4_ = iStack_124;
  auVar75._0_4_ = local_128;
  auVar75._8_4_ = iStack_120;
  auVar75._12_4_ = iStack_11c;
  auVar130._0_4_ = local_128 + local_198;
  auVar130._4_4_ = iStack_124 + iStack_194;
  auVar130._8_4_ = iStack_120 + iStack_190;
  auVar130._12_4_ = iStack_11c + iStack_18c;
  auVar151 = pmulld(auVar60,auVar188);
  auVar154 = pmulld(auVar75,auVar126);
  auVar63._4_4_ = iStack_184;
  auVar63._0_4_ = local_188;
  auVar63._8_4_ = iStack_180;
  auVar63._12_4_ = iStack_17c;
  auVar73._4_4_ = iStack_134;
  auVar73._0_4_ = local_138;
  auVar73._8_4_ = iStack_130;
  auVar73._12_4_ = iStack_12c;
  auVar175._0_4_ = local_138 + local_188;
  auVar175._4_4_ = iStack_134 + iStack_184;
  auVar175._8_4_ = iStack_130 + iStack_180;
  auVar175._12_4_ = iStack_12c + iStack_17c;
  auVar162 = pmulld(auVar63,auVar188);
  auVar185 = pmulld(auVar73,auVar126);
  auVar65._4_4_ = iStack_174;
  auVar65._0_4_ = local_178;
  auVar65._8_4_ = iStack_170;
  auVar65._12_4_ = iStack_16c;
  auVar70._4_4_ = local_158[5];
  auVar70._0_4_ = local_158[4];
  auVar70._8_4_ = local_158[6];
  auVar70._12_4_ = iStack_13c;
  auVar142._0_4_ = local_158[4] + local_178;
  auVar142._4_4_ = local_158[5] + iStack_174;
  auVar142._8_4_ = local_158[6] + iStack_170;
  auVar142._12_4_ = iStack_13c + iStack_16c;
  auVar167 = pmulld(auVar65,auVar188);
  auVar178 = pmulld(auVar70,auVar126);
  auVar66._4_4_ = iStack_164;
  auVar66._0_4_ = local_168;
  auVar66._8_4_ = iStack_160;
  auVar66._12_4_ = iStack_15c;
  auVar214 = pmulld(auVar188,auVar66);
  auVar68._4_4_ = local_158[1];
  auVar68._0_4_ = local_158[0];
  auVar68._8_4_ = local_158[2];
  auVar68._12_4_ = local_158[3];
  auVar180 = pmulld(auVar68,auVar126);
  auVar195._0_4_ = local_158[0] + local_168;
  auVar195._4_4_ = local_158[1] + iStack_164;
  auVar195._8_4_ = local_158[2] + iStack_160;
  auVar195._12_4_ = local_158[3] + iStack_15c;
  auVar134 = pmulld(auVar195,auVar126);
  local_158[0] = auVar134._0_4_ + iVar115 >> auVar217;
  local_158[1] = auVar134._4_4_ + iVar115 >> auVar217;
  local_158[2] = auVar134._8_4_ + iVar115 >> auVar217;
  local_158[3] = auVar134._12_4_ + iVar115 >> auVar217;
  auVar134 = pmulld(auVar142,auVar126);
  local_158[4] = auVar134._0_4_ + iVar115 >> auVar217;
  local_158[5] = auVar134._4_4_ + iVar115 >> auVar217;
  local_158[6] = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_13c = auVar134._12_4_ + iVar115 >> auVar217;
  auVar166 = pmulld(auVar175,auVar126);
  auVar134 = pmulld(auVar130,auVar126);
  local_138 = auVar166._0_4_ + iVar115 >> auVar217;
  iStack_134 = auVar166._4_4_ + iVar115 >> auVar217;
  iStack_130 = auVar166._8_4_ + iVar115 >> auVar217;
  iStack_12c = auVar166._12_4_ + iVar115 >> auVar217;
  local_128 = auVar134._0_4_ + iVar115 >> auVar217;
  iStack_124 = auVar134._4_4_ + iVar115 >> auVar217;
  iStack_120 = auVar134._8_4_ + iVar115 >> auVar217;
  iStack_11c = auVar134._12_4_ + iVar115 >> auVar217;
  local_198 = auVar151._0_4_ + iVar115 + auVar154._0_4_ >> auVar217;
  iStack_194 = auVar151._4_4_ + iVar115 + auVar154._4_4_ >> auVar217;
  iStack_190 = auVar151._8_4_ + iVar115 + auVar154._8_4_ >> auVar217;
  iStack_18c = auVar151._12_4_ + iVar115 + auVar154._12_4_ >> auVar217;
  local_188 = auVar162._0_4_ + iVar115 + auVar185._0_4_ >> auVar217;
  iStack_184 = auVar162._4_4_ + iVar115 + auVar185._4_4_ >> auVar217;
  iStack_180 = auVar162._8_4_ + iVar115 + auVar185._8_4_ >> auVar217;
  iStack_17c = auVar162._12_4_ + iVar115 + auVar185._12_4_ >> auVar217;
  local_178 = auVar167._0_4_ + iVar115 + auVar178._0_4_ >> auVar217;
  iStack_174 = auVar167._4_4_ + iVar115 + auVar178._4_4_ >> auVar217;
  iStack_170 = auVar167._8_4_ + iVar115 + auVar178._8_4_ >> auVar217;
  iStack_16c = auVar167._12_4_ + iVar115 + auVar178._12_4_ >> auVar217;
  local_168 = auVar214._0_4_ + iVar115 + auVar180._0_4_ >> auVar217;
  iStack_164 = auVar214._4_4_ + iVar115 + auVar180._4_4_ >> auVar217;
  iStack_160 = auVar214._8_4_ + iVar115 + auVar180._8_4_ >> auVar217;
  iStack_15c = auVar214._12_4_ + iVar115 + auVar180._12_4_ >> auVar217;
  lVar109 = 0x3f0;
  lVar111 = 0;
  do {
    iVar115 = *(int *)((long)local_458 + lVar111 + 4);
    iVar116 = *(int *)((long)local_458 + lVar111 + 8);
    iVar145 = *(int *)((long)local_458 + lVar111 + 0xc);
    iVar120 = *(int *)((long)local_458 + lVar109 + 4);
    iVar112 = *(int *)((long)local_458 + lVar109 + 8);
    iVar113 = *(int *)((long)local_458 + lVar109 + 0xc);
    iVar131 = *(int *)((long)local_458 + lVar109) + *(int *)((long)local_458 + lVar111);
    iVar143 = iVar120 + iVar115;
    iVar146 = iVar112 + iVar116;
    iVar148 = iVar113 + iVar145;
    iVar118 = *(int *)((long)local_458 + lVar111) - *(int *)((long)local_458 + lVar109);
    iVar115 = iVar115 - iVar120;
    iVar116 = iVar116 - iVar112;
    iVar145 = iVar145 - iVar113;
    uVar197 = (uint)(iVar131 < iVar121) * iVar121 | (uint)(iVar131 >= iVar121) * iVar131;
    uVar203 = (uint)(iVar143 < iVar121) * iVar121 | (uint)(iVar143 >= iVar121) * iVar143;
    uVar205 = (uint)(iVar146 < iVar121) * iVar121 | (uint)(iVar146 >= iVar121) * iVar146;
    uVar207 = (uint)(iVar148 < iVar121) * iVar121 | (uint)(iVar148 >= iVar121) * iVar148;
    uVar132 = (uint)(iVar118 < iVar121) * iVar121 | (uint)(iVar118 >= iVar121) * iVar118;
    uVar144 = (uint)(iVar115 < iVar121) * iVar121 | (uint)(iVar115 >= iVar121) * iVar115;
    uVar147 = (uint)(iVar116 < iVar121) * iVar121 | (uint)(iVar116 >= iVar121) * iVar116;
    uVar149 = (uint)(iVar145 < iVar121) * iVar121 | (uint)(iVar145 >= iVar121) * iVar145;
    puVar108 = (uint *)((long)*out + lVar111);
    *puVar108 = (uint)(iVar117 < (int)uVar197) * iVar117 | (iVar117 >= (int)uVar197) * uVar197;
    puVar108[1] = (uint)(iVar117 < (int)uVar203) * iVar117 | (iVar117 >= (int)uVar203) * uVar203;
    puVar108[2] = (uint)(iVar117 < (int)uVar205) * iVar117 | (iVar117 >= (int)uVar205) * uVar205;
    puVar108[3] = (uint)(iVar117 < (int)uVar207) * iVar117 | (iVar117 >= (int)uVar207) * uVar207;
    puVar108 = (uint *)((long)*out + lVar109);
    *puVar108 = (uint)(iVar117 < (int)uVar132) * iVar117 | (iVar117 >= (int)uVar132) * uVar132;
    puVar108[1] = (uint)(iVar117 < (int)uVar144) * iVar117 | (iVar117 >= (int)uVar144) * uVar144;
    puVar108[2] = (uint)(iVar117 < (int)uVar147) * iVar117 | (iVar117 >= (int)uVar147) * uVar147;
    puVar108[3] = (uint)(iVar117 < (int)uVar149) * iVar117 | (iVar117 >= (int)uVar149) * uVar149;
    lVar109 = lVar109 + -0x10;
    lVar111 = lVar111 + 0x10;
  } while (lVar109 != 0x1f0);
  if (do_cols == 0) {
    iVar117 = 10;
    if (10 < bd) {
      iVar117 = bd;
    }
    local_58 = 0x20 << ((byte)iVar117 & 0x1f);
    local_48 = -local_58;
    local_58 = local_58 + -1;
    iVar117 = 1 << ((char)out_shift - 1U & 0x1f);
    uVar110 = 0xfffffffffffffffc;
    auVar217 = ZEXT416((uint)out_shift);
    iStack_54 = local_58;
    iStack_50 = local_58;
    iStack_4c = local_58;
    iStack_44 = local_48;
    iStack_40 = local_48;
    iStack_3c = local_48;
    do {
      if (out_shift != 0) {
        iVar115 = *(int *)((long)*out + 4);
        lVar100 = (*out)[1];
        iVar116 = *(int *)((long)*out + 0xc);
        lVar101 = out[1][0];
        iVar145 = *(int *)((long)out[1] + 4);
        lVar102 = out[1][1];
        iVar120 = *(int *)((long)out[1] + 0xc);
        lVar103 = out[2][0];
        iVar112 = *(int *)((long)out[2] + 4);
        lVar104 = out[2][1];
        iVar121 = *(int *)((long)out[2] + 0xc);
        lVar105 = out[3][0];
        iVar113 = *(int *)((long)out[3] + 4);
        lVar106 = out[3][1];
        iVar118 = *(int *)((long)out[3] + 0xc);
        *(int *)*out = (int)(*out)[0] + iVar117 >> auVar217;
        *(int *)((long)*out + 4) = iVar115 + iVar117 >> auVar217;
        *(int *)(*out + 1) = (int)lVar100 + iVar117 >> auVar217;
        *(int *)((long)*out + 0xc) = iVar116 + iVar117 >> auVar217;
        *(int *)out[1] = (int)lVar101 + iVar117 >> auVar217;
        *(int *)((long)out[1] + 4) = iVar145 + iVar117 >> auVar217;
        *(int *)(out[1] + 1) = (int)lVar102 + iVar117 >> auVar217;
        *(int *)((long)out[1] + 0xc) = iVar120 + iVar117 >> auVar217;
        *(int *)out[2] = (int)lVar103 + iVar117 >> auVar217;
        *(int *)((long)out[2] + 4) = iVar112 + iVar117 >> auVar217;
        *(int *)(out[2] + 1) = (int)lVar104 + iVar117 >> auVar217;
        *(int *)((long)out[2] + 0xc) = iVar121 + iVar117 >> auVar217;
        *(int *)out[3] = (int)lVar105 + iVar117 >> auVar217;
        *(int *)((long)out[3] + 4) = iVar113 + iVar117 >> auVar217;
        *(int *)(out[3] + 1) = (int)lVar106 + iVar117 >> auVar217;
        *(int *)((long)out[3] + 0xc) = iVar118 + iVar117 >> auVar217;
      }
      highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_48,(__m128i *)&local_58,4);
      uVar110 = uVar110 + 4;
      out = out + 4;
    } while (uVar110 < 0x3c);
  }
  return;
}

Assistant:

static void idct64x64_low16_sse4_1(__m128i *in, __m128i *out, int bit,
                                   int do_cols, int bd, int out_shift) {
  int i, j;
  const int32_t *cospi = cospi_arr(bit);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);

  const __m128i cospi1 = _mm_set1_epi32(cospi[1]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi3 = _mm_set1_epi32(cospi[3]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi5 = _mm_set1_epi32(cospi[5]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi7 = _mm_set1_epi32(cospi[7]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi9 = _mm_set1_epi32(cospi[9]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi11 = _mm_set1_epi32(cospi[11]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi13 = _mm_set1_epi32(cospi[13]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospi15 = _mm_set1_epi32(cospi[15]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi51 = _mm_set1_epi32(cospi[51]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospi55 = _mm_set1_epi32(cospi[55]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi59 = _mm_set1_epi32(cospi[59]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi63 = _mm_set1_epi32(cospi[63]);

  const __m128i cospim4 = _mm_set1_epi32(-cospi[4]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospim12 = _mm_set1_epi32(-cospi[12]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim20 = _mm_set1_epi32(-cospi[20]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospim28 = _mm_set1_epi32(-cospi[28]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospim44 = _mm_set1_epi32(-cospi[44]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospim49 = _mm_set1_epi32(-cospi[49]);
  const __m128i cospim50 = _mm_set1_epi32(-cospi[50]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospim53 = _mm_set1_epi32(-cospi[53]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim57 = _mm_set1_epi32(-cospi[57]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i cospim60 = _mm_set1_epi32(-cospi[60]);
  const __m128i cospim61 = _mm_set1_epi32(-cospi[61]);

  {
    __m128i u[64];
    __m128i tmp1, tmp2, tmp3, tmp4;
    // stage 1
    u[0] = in[0];
    u[32] = in[1];
    u[36] = in[9];
    u[40] = in[5];
    u[44] = in[13];
    u[48] = in[3];
    u[52] = in[11];
    u[56] = in[7];
    u[60] = in[15];
    u[16] = in[2];
    u[20] = in[10];
    u[24] = in[6];
    u[28] = in[14];
    u[4] = in[8];
    u[8] = in[4];
    u[12] = in[12];

    // stage 2
    u[63] = half_btf_0_sse4_1(&cospi1, &u[32], &rnding, bit);
    u[32] = half_btf_0_sse4_1(&cospi63, &u[32], &rnding, bit);
    u[35] = half_btf_0_sse4_1(&cospim49, &u[60], &rnding, bit);
    u[60] = half_btf_0_sse4_1(&cospi15, &u[60], &rnding, bit);
    u[59] = half_btf_0_sse4_1(&cospi9, &u[36], &rnding, bit);
    u[36] = half_btf_0_sse4_1(&cospi55, &u[36], &rnding, bit);
    u[39] = half_btf_0_sse4_1(&cospim57, &u[56], &rnding, bit);
    u[56] = half_btf_0_sse4_1(&cospi7, &u[56], &rnding, bit);
    u[55] = half_btf_0_sse4_1(&cospi5, &u[40], &rnding, bit);
    u[40] = half_btf_0_sse4_1(&cospi59, &u[40], &rnding, bit);
    u[43] = half_btf_0_sse4_1(&cospim53, &u[52], &rnding, bit);
    u[52] = half_btf_0_sse4_1(&cospi11, &u[52], &rnding, bit);
    u[47] = half_btf_0_sse4_1(&cospim61, &u[48], &rnding, bit);
    u[48] = half_btf_0_sse4_1(&cospi3, &u[48], &rnding, bit);
    u[51] = half_btf_0_sse4_1(&cospi13, &u[44], &rnding, bit);
    u[44] = half_btf_0_sse4_1(&cospi51, &u[44], &rnding, bit);

    // stage 3
    u[31] = half_btf_0_sse4_1(&cospi2, &u[16], &rnding, bit);
    u[16] = half_btf_0_sse4_1(&cospi62, &u[16], &rnding, bit);
    u[19] = half_btf_0_sse4_1(&cospim50, &u[28], &rnding, bit);
    u[28] = half_btf_0_sse4_1(&cospi14, &u[28], &rnding, bit);
    u[27] = half_btf_0_sse4_1(&cospi10, &u[20], &rnding, bit);
    u[20] = half_btf_0_sse4_1(&cospi54, &u[20], &rnding, bit);
    u[23] = half_btf_0_sse4_1(&cospim58, &u[24], &rnding, bit);
    u[24] = half_btf_0_sse4_1(&cospi6, &u[24], &rnding, bit);
    u[33] = u[32];
    u[34] = u[35];
    u[37] = u[36];
    u[38] = u[39];
    u[41] = u[40];
    u[42] = u[43];
    u[45] = u[44];
    u[46] = u[47];
    u[49] = u[48];
    u[50] = u[51];
    u[53] = u[52];
    u[54] = u[55];
    u[57] = u[56];
    u[58] = u[59];
    u[61] = u[60];
    u[62] = u[63];

    // stage 4
    u[15] = half_btf_0_sse4_1(&cospi4, &u[8], &rnding, bit);
    u[8] = half_btf_0_sse4_1(&cospi60, &u[8], &rnding, bit);
    u[11] = half_btf_0_sse4_1(&cospim52, &u[12], &rnding, bit);
    u[12] = half_btf_0_sse4_1(&cospi12, &u[12], &rnding, bit);

    u[17] = u[16];
    u[18] = u[19];
    u[21] = u[20];
    u[22] = u[23];
    u[25] = u[24];
    u[26] = u[27];
    u[29] = u[28];
    u[30] = u[31];

    tmp1 = half_btf_sse4_1(&cospim4, &u[33], &cospi60, &u[62], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim60, &u[34], &cospim4, &u[61], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim36, &u[37], &cospi28, &u[58], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim28, &u[38], &cospim36, &u[57], &rnding, bit);
    u[57] = half_btf_sse4_1(&cospim36, &u[38], &cospi28, &u[57], &rnding, bit);
    u[58] = half_btf_sse4_1(&cospi28, &u[37], &cospi36, &u[58], &rnding, bit);
    u[61] = half_btf_sse4_1(&cospim4, &u[34], &cospi60, &u[61], &rnding, bit);
    u[62] = half_btf_sse4_1(&cospi60, &u[33], &cospi4, &u[62], &rnding, bit);
    u[33] = tmp1;
    u[34] = tmp2;
    u[37] = tmp3;
    u[38] = tmp4;

    tmp1 = half_btf_sse4_1(&cospim20, &u[41], &cospi44, &u[54], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim44, &u[42], &cospim20, &u[53], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim52, &u[45], &cospi12, &u[50], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim12, &u[46], &cospim52, &u[49], &rnding, bit);
    u[49] = half_btf_sse4_1(&cospim52, &u[46], &cospi12, &u[49], &rnding, bit);
    u[50] = half_btf_sse4_1(&cospi12, &u[45], &cospi52, &u[50], &rnding, bit);
    u[53] = half_btf_sse4_1(&cospim20, &u[42], &cospi44, &u[53], &rnding, bit);
    u[54] = half_btf_sse4_1(&cospi44, &u[41], &cospi20, &u[54], &rnding, bit);
    u[41] = tmp1;
    u[42] = tmp2;
    u[45] = tmp3;
    u[46] = tmp4;

    // stage 5
    u[7] = half_btf_0_sse4_1(&cospi8, &u[4], &rnding, bit);
    u[4] = half_btf_0_sse4_1(&cospi56, &u[4], &rnding, bit);

    u[9] = u[8];
    u[10] = u[11];
    u[13] = u[12];
    u[14] = u[15];

    tmp1 = half_btf_sse4_1(&cospim8, &u[17], &cospi56, &u[30], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim56, &u[18], &cospim8, &u[29], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim40, &u[21], &cospi24, &u[26], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim24, &u[22], &cospim40, &u[25], &rnding, bit);
    u[25] = half_btf_sse4_1(&cospim40, &u[22], &cospi24, &u[25], &rnding, bit);
    u[26] = half_btf_sse4_1(&cospi24, &u[21], &cospi40, &u[26], &rnding, bit);
    u[29] = half_btf_sse4_1(&cospim8, &u[18], &cospi56, &u[29], &rnding, bit);
    u[30] = half_btf_sse4_1(&cospi56, &u[17], &cospi8, &u[30], &rnding, bit);
    u[17] = tmp1;
    u[18] = tmp2;
    u[21] = tmp3;
    u[22] = tmp4;

    for (i = 32; i < 64; i += 8) {
      addsub_sse4_1(u[i + 0], u[i + 3], &u[i + 0], &u[i + 3], &clamp_lo,
                    &clamp_hi);
      addsub_sse4_1(u[i + 1], u[i + 2], &u[i + 1], &u[i + 2], &clamp_lo,
                    &clamp_hi);

      addsub_sse4_1(u[i + 7], u[i + 4], &u[i + 7], &u[i + 4], &clamp_lo,
                    &clamp_hi);
      addsub_sse4_1(u[i + 6], u[i + 5], &u[i + 6], &u[i + 5], &clamp_lo,
                    &clamp_hi);
    }

    // stage 6
    tmp1 = half_btf_0_sse4_1(&cospi32, &u[0], &rnding, bit);
    u[1] = half_btf_0_sse4_1(&cospi32, &u[0], &rnding, bit);
    u[0] = tmp1;
    u[5] = u[4];
    u[6] = u[7];

    tmp1 = half_btf_sse4_1(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    u[14] = half_btf_sse4_1(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    u[9] = tmp1;
    tmp2 = half_btf_sse4_1(&cospim48, &u[10], &cospim16, &u[13], &rnding, bit);
    u[13] = half_btf_sse4_1(&cospim16, &u[10], &cospi48, &u[13], &rnding, bit);
    u[10] = tmp2;

    for (i = 16; i < 32; i += 8) {
      addsub_sse4_1(u[i + 0], u[i + 3], &u[i + 0], &u[i + 3], &clamp_lo,
                    &clamp_hi);
      addsub_sse4_1(u[i + 1], u[i + 2], &u[i + 1], &u[i + 2], &clamp_lo,
                    &clamp_hi);

      addsub_sse4_1(u[i + 7], u[i + 4], &u[i + 7], &u[i + 4], &clamp_lo,
                    &clamp_hi);
      addsub_sse4_1(u[i + 6], u[i + 5], &u[i + 6], &u[i + 5], &clamp_lo,
                    &clamp_hi);
    }

    tmp1 = half_btf_sse4_1(&cospim8, &u[34], &cospi56, &u[61], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim8, &u[35], &cospi56, &u[60], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim56, &u[36], &cospim8, &u[59], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim56, &u[37], &cospim8, &u[58], &rnding, bit);
    u[58] = half_btf_sse4_1(&cospim8, &u[37], &cospi56, &u[58], &rnding, bit);
    u[59] = half_btf_sse4_1(&cospim8, &u[36], &cospi56, &u[59], &rnding, bit);
    u[60] = half_btf_sse4_1(&cospi56, &u[35], &cospi8, &u[60], &rnding, bit);
    u[61] = half_btf_sse4_1(&cospi56, &u[34], &cospi8, &u[61], &rnding, bit);
    u[34] = tmp1;
    u[35] = tmp2;
    u[36] = tmp3;
    u[37] = tmp4;

    tmp1 = half_btf_sse4_1(&cospim40, &u[42], &cospi24, &u[53], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim40, &u[43], &cospi24, &u[52], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim24, &u[44], &cospim40, &u[51], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim24, &u[45], &cospim40, &u[50], &rnding, bit);
    u[50] = half_btf_sse4_1(&cospim40, &u[45], &cospi24, &u[50], &rnding, bit);
    u[51] = half_btf_sse4_1(&cospim40, &u[44], &cospi24, &u[51], &rnding, bit);
    u[52] = half_btf_sse4_1(&cospi24, &u[43], &cospi40, &u[52], &rnding, bit);
    u[53] = half_btf_sse4_1(&cospi24, &u[42], &cospi40, &u[53], &rnding, bit);
    u[42] = tmp1;
    u[43] = tmp2;
    u[44] = tmp3;
    u[45] = tmp4;

    // stage 7
    u[3] = u[0];
    u[2] = u[1];
    tmp1 = half_btf_sse4_1(&cospim32, &u[5], &cospi32, &u[6], &rnding, bit);
    u[6] = half_btf_sse4_1(&cospi32, &u[5], &cospi32, &u[6], &rnding, bit);
    u[5] = tmp1;
    addsub_sse4_1(u[8], u[11], &u[8], &u[11], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[9], u[10], &u[9], &u[10], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[15], u[12], &u[15], &u[12], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[14], u[13], &u[14], &u[13], &clamp_lo, &clamp_hi);

    tmp1 = half_btf_sse4_1(&cospim16, &u[18], &cospi48, &u[29], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim16, &u[19], &cospi48, &u[28], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim48, &u[20], &cospim16, &u[27], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim48, &u[21], &cospim16, &u[26], &rnding, bit);
    u[26] = half_btf_sse4_1(&cospim16, &u[21], &cospi48, &u[26], &rnding, bit);
    u[27] = half_btf_sse4_1(&cospim16, &u[20], &cospi48, &u[27], &rnding, bit);
    u[28] = half_btf_sse4_1(&cospi48, &u[19], &cospi16, &u[28], &rnding, bit);
    u[29] = half_btf_sse4_1(&cospi48, &u[18], &cospi16, &u[29], &rnding, bit);
    u[18] = tmp1;
    u[19] = tmp2;
    u[20] = tmp3;
    u[21] = tmp4;

    for (i = 32; i < 64; i += 16) {
      for (j = i; j < i + 4; j++) {
        addsub_sse4_1(u[j], u[j ^ 7], &u[j], &u[j ^ 7], &clamp_lo, &clamp_hi);
        addsub_sse4_1(u[j ^ 15], u[j ^ 8], &u[j ^ 15], &u[j ^ 8], &clamp_lo,
                      &clamp_hi);
      }
    }

    // stage 8
    for (i = 0; i < 4; ++i) {
      addsub_sse4_1(u[i], u[7 - i], &u[i], &u[7 - i], &clamp_lo, &clamp_hi);
    }

    idct64_stage8_sse4_1(u, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                         &cospim48, &clamp_lo, &clamp_hi, &rnding, bit);

    // stage 9
    idct64_stage9_sse4_1(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                         bit);

    // stage 10
    idct64_stage10_sse4_1(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                          bit);

    // stage 11
    idct64_stage11_sse4_1(u, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}